

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftlib.c
# Opt level: O3

void iffts1(float *ioptr,long M,long Rows,float *Utbl,short *BRLow)

{
  long lVar1;
  bool bVar2;
  undefined8 uVar3;
  byte bVar4;
  byte bVar5;
  long StageCnt;
  float *pfVar6;
  ulong uVar7;
  float *pstrt;
  long unaff_RBP;
  double dVar8;
  long in_R9;
  long in_R10;
  long in_R11;
  long unaff_R13;
  long unaff_R15;
  ulong uVar9;
  ushort uVar10;
  ulong uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  float scale;
  undefined1 in_ZMM16 [64];
  undefined1 in_ZMM17 [64];
  undefined1 in_ZMM18 [64];
  undefined1 in_ZMM19 [64];
  undefined1 in_ZMM21 [64];
  undefined1 in_ZMM24 [64];
  undefined1 in_ZMM25 [64];
  undefined1 in_ZMM26 [64];
  undefined1 in_ZMM27 [64];
  undefined1 in_ZMM28 [64];
  undefined1 in_ZMM29 [64];
  undefined1 in_ZMM30 [64];
  undefined1 in_ZMM31 [64];
  
  dVar8 = (double)(0x3ff0000000000000 - (M << 0x34));
  scale = (float)dVar8;
  switch(M) {
  case 0:
    break;
  case 1:
    if (0 < Rows) {
      auVar56 = vbroadcastss_avx512f(ZEXT416((uint)scale));
      auVar57 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar58 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      uVar9 = 0;
      auVar59 = vpbroadcastq_avx512f();
      do {
        auVar60 = vpbroadcastq_avx512f();
        uVar9 = uVar9 + 0x10;
        auVar61 = vporq_avx512f(auVar60,auVar57);
        auVar60 = vporq_avx512f(auVar60,auVar58);
        uVar3 = vpcmpuq_avx512f(auVar60,auVar59,2);
        bVar4 = (byte)uVar3;
        uVar3 = vpcmpuq_avx512f(auVar61,auVar59,2);
        bVar5 = (byte)uVar3;
        uVar10 = CONCAT11(bVar5,bVar4);
        uVar7 = (ulong)uVar10;
        auVar60 = vgatherdps_avx512f(*ioptr);
        auVar23._4_4_ = (uint)((byte)(uVar10 >> 1) & 1) * auVar60._4_4_;
        auVar23._0_4_ = (uint)(bVar4 & 1) * auVar60._0_4_;
        auVar23._8_4_ = (uint)((byte)(uVar10 >> 2) & 1) * auVar60._8_4_;
        auVar23._12_4_ = (uint)((byte)(uVar10 >> 3) & 1) * auVar60._12_4_;
        auVar23._16_4_ = (uint)((byte)(uVar10 >> 4) & 1) * auVar60._16_4_;
        auVar23._20_4_ = (uint)((byte)(uVar10 >> 5) & 1) * auVar60._20_4_;
        auVar23._24_4_ = (uint)((byte)(uVar10 >> 6) & 1) * auVar60._24_4_;
        auVar23._28_4_ = (uint)((byte)(uVar10 >> 7) & 1) * auVar60._28_4_;
        auVar23._32_4_ = (uint)(bVar5 & 1) * auVar60._32_4_;
        auVar23._36_4_ = (uint)(bVar5 >> 1 & 1) * auVar60._36_4_;
        auVar23._40_4_ = (uint)(bVar5 >> 2 & 1) * auVar60._40_4_;
        auVar23._44_4_ = (uint)(bVar5 >> 3 & 1) * auVar60._44_4_;
        auVar23._48_4_ = (uint)(bVar5 >> 4 & 1) * auVar60._48_4_;
        auVar23._52_4_ = (uint)(bVar5 >> 5 & 1) * auVar60._52_4_;
        auVar23._56_4_ = (uint)(bVar5 >> 6 & 1) * auVar60._56_4_;
        auVar23._60_4_ = (uint)(bVar5 >> 7) * auVar60._60_4_;
        auVar60 = vgatherdps_avx512f(ioptr[1]);
        auVar24._4_4_ = (uint)((byte)(uVar10 >> 1) & 1) * auVar60._4_4_;
        auVar24._0_4_ = (uint)(bVar4 & 1) * auVar60._0_4_;
        auVar24._8_4_ = (uint)((byte)(uVar10 >> 2) & 1) * auVar60._8_4_;
        auVar24._12_4_ = (uint)((byte)(uVar10 >> 3) & 1) * auVar60._12_4_;
        auVar24._16_4_ = (uint)((byte)(uVar10 >> 4) & 1) * auVar60._16_4_;
        auVar24._20_4_ = (uint)((byte)(uVar10 >> 5) & 1) * auVar60._20_4_;
        auVar24._24_4_ = (uint)((byte)(uVar10 >> 6) & 1) * auVar60._24_4_;
        auVar24._28_4_ = (uint)((byte)(uVar10 >> 7) & 1) * auVar60._28_4_;
        auVar24._32_4_ = (uint)(bVar5 & 1) * auVar60._32_4_;
        auVar24._36_4_ = (uint)(bVar5 >> 1 & 1) * auVar60._36_4_;
        auVar24._40_4_ = (uint)(bVar5 >> 2 & 1) * auVar60._40_4_;
        auVar24._44_4_ = (uint)(bVar5 >> 3 & 1) * auVar60._44_4_;
        auVar24._48_4_ = (uint)(bVar5 >> 4 & 1) * auVar60._48_4_;
        auVar24._52_4_ = (uint)(bVar5 >> 5 & 1) * auVar60._52_4_;
        auVar24._56_4_ = (uint)(bVar5 >> 6 & 1) * auVar60._56_4_;
        auVar24._60_4_ = (uint)(bVar5 >> 7) * auVar60._60_4_;
        auVar60 = vgatherdps_avx512f(*(undefined4 *)((long)ioptr + unaff_RBP));
        auVar25._4_4_ = (uint)((byte)(uVar10 >> 1) & 1) * auVar60._4_4_;
        auVar25._0_4_ = (uint)(bVar4 & 1) * auVar60._0_4_;
        auVar25._8_4_ = (uint)((byte)(uVar10 >> 2) & 1) * auVar60._8_4_;
        auVar25._12_4_ = (uint)((byte)(uVar10 >> 3) & 1) * auVar60._12_4_;
        auVar25._16_4_ = (uint)((byte)(uVar10 >> 4) & 1) * auVar60._16_4_;
        auVar25._20_4_ = (uint)((byte)(uVar10 >> 5) & 1) * auVar60._20_4_;
        auVar25._24_4_ = (uint)((byte)(uVar10 >> 6) & 1) * auVar60._24_4_;
        auVar25._28_4_ = (uint)((byte)(uVar10 >> 7) & 1) * auVar60._28_4_;
        auVar25._32_4_ = (uint)(bVar5 & 1) * auVar60._32_4_;
        auVar25._36_4_ = (uint)(bVar5 >> 1 & 1) * auVar60._36_4_;
        auVar25._40_4_ = (uint)(bVar5 >> 2 & 1) * auVar60._40_4_;
        auVar25._44_4_ = (uint)(bVar5 >> 3 & 1) * auVar60._44_4_;
        auVar25._48_4_ = (uint)(bVar5 >> 4 & 1) * auVar60._48_4_;
        auVar25._52_4_ = (uint)(bVar5 >> 5 & 1) * auVar60._52_4_;
        auVar25._56_4_ = (uint)(bVar5 >> 6 & 1) * auVar60._56_4_;
        auVar25._60_4_ = (uint)(bVar5 >> 7) * auVar60._60_4_;
        auVar60 = vgatherdps_avx512f(*(undefined4 *)((long)ioptr + M));
        auVar26._4_4_ = (uint)((byte)(uVar10 >> 1) & 1) * auVar60._4_4_;
        auVar26._0_4_ = (uint)(bVar4 & 1) * auVar60._0_4_;
        auVar26._8_4_ = (uint)((byte)(uVar10 >> 2) & 1) * auVar60._8_4_;
        auVar26._12_4_ = (uint)((byte)(uVar10 >> 3) & 1) * auVar60._12_4_;
        auVar26._16_4_ = (uint)((byte)(uVar10 >> 4) & 1) * auVar60._16_4_;
        auVar26._20_4_ = (uint)((byte)(uVar10 >> 5) & 1) * auVar60._20_4_;
        auVar26._24_4_ = (uint)((byte)(uVar10 >> 6) & 1) * auVar60._24_4_;
        auVar26._28_4_ = (uint)((byte)(uVar10 >> 7) & 1) * auVar60._28_4_;
        auVar26._32_4_ = (uint)(bVar5 & 1) * auVar60._32_4_;
        auVar26._36_4_ = (uint)(bVar5 >> 1 & 1) * auVar60._36_4_;
        auVar26._40_4_ = (uint)(bVar5 >> 2 & 1) * auVar60._40_4_;
        auVar26._44_4_ = (uint)(bVar5 >> 3 & 1) * auVar60._44_4_;
        auVar26._48_4_ = (uint)(bVar5 >> 4 & 1) * auVar60._48_4_;
        auVar26._52_4_ = (uint)(bVar5 >> 5 & 1) * auVar60._52_4_;
        auVar26._56_4_ = (uint)(bVar5 >> 6 & 1) * auVar60._56_4_;
        auVar26._60_4_ = (uint)(bVar5 >> 7) * auVar60._60_4_;
        auVar60 = vaddps_avx512f(auVar25,auVar23);
        auVar61 = vsubps_avx512f(auVar23,auVar25);
        auVar65 = vaddps_avx512f(auVar26,auVar24);
        auVar66 = vsubps_avx512f(auVar24,auVar26);
        auVar60 = vmulps_avx512f(auVar60,auVar56);
        auVar61 = vmulps_avx512f(auVar61,auVar56);
        auVar65 = vmulps_avx512f(auVar65,auVar56);
        auVar66 = vmulps_avx512f(auVar66,auVar56);
        vscatterdps_avx512f(ZEXT864(ioptr) + _DAT_0010a040,uVar7,auVar60);
        vscatterdps_avx512f(ZEXT864(ioptr) + _DAT_0010a100,uVar7,auVar65);
        vscatterdps_avx512f(ZEXT864(ioptr) + _DAT_0010a080,uVar7,auVar61);
        vscatterdps_avx512f(ZEXT864(ioptr) + _DAT_0010a0c0,uVar7,auVar66);
        ioptr = ioptr + 0x40;
      } while ((Rows + 0xfU & 0xfffffffffffffff0) != uVar9);
    }
    break;
  case 2:
    if (0 < Rows) {
      auVar56 = vbroadcastss_avx512f(ZEXT416((uint)scale));
      auVar57 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar58 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      uVar9 = 0;
      auVar59 = vpbroadcastq_avx512f();
      do {
        auVar60 = vpbroadcastq_avx512f();
        auVar12 = vxorps_avx512vl(in_ZMM16._0_16_,in_ZMM16._0_16_);
        auVar13 = vxorps_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
        auVar14 = vxorps_avx512vl(in_ZMM18._0_16_,in_ZMM18._0_16_);
        auVar15 = vxorps_avx512vl(in_ZMM19._0_16_,in_ZMM19._0_16_);
        uVar9 = uVar9 + 0x10;
        auVar61 = vporq_avx512f(auVar60,auVar57);
        auVar60 = vporq_avx512f(auVar60,auVar58);
        uVar3 = vpcmpuq_avx512f(auVar60,auVar59,2);
        bVar4 = (byte)uVar3;
        uVar3 = vpcmpuq_avx512f(auVar61,auVar59,2);
        bVar5 = (byte)uVar3;
        uVar10 = CONCAT11(bVar5,bVar4);
        uVar7 = (ulong)uVar10;
        auVar60 = vgatherdps_avx512f(*ioptr);
        auVar27._4_4_ = (uint)((byte)(uVar10 >> 1) & 1) * auVar60._4_4_;
        auVar27._0_4_ = (uint)(bVar4 & 1) * auVar60._0_4_;
        auVar27._8_4_ = (uint)((byte)(uVar10 >> 2) & 1) * auVar60._8_4_;
        auVar27._12_4_ = (uint)((byte)(uVar10 >> 3) & 1) * auVar60._12_4_;
        auVar27._16_4_ = (uint)((byte)(uVar10 >> 4) & 1) * auVar60._16_4_;
        auVar27._20_4_ = (uint)((byte)(uVar10 >> 5) & 1) * auVar60._20_4_;
        auVar27._24_4_ = (uint)((byte)(uVar10 >> 6) & 1) * auVar60._24_4_;
        auVar27._28_4_ = (uint)((byte)(uVar10 >> 7) & 1) * auVar60._28_4_;
        auVar27._32_4_ = (uint)(bVar5 & 1) * auVar60._32_4_;
        auVar27._36_4_ = (uint)(bVar5 >> 1 & 1) * auVar60._36_4_;
        auVar27._40_4_ = (uint)(bVar5 >> 2 & 1) * auVar60._40_4_;
        auVar27._44_4_ = (uint)(bVar5 >> 3 & 1) * auVar60._44_4_;
        auVar27._48_4_ = (uint)(bVar5 >> 4 & 1) * auVar60._48_4_;
        auVar27._52_4_ = (uint)(bVar5 >> 5 & 1) * auVar60._52_4_;
        auVar27._56_4_ = (uint)(bVar5 >> 6 & 1) * auVar60._56_4_;
        auVar27._60_4_ = (uint)(bVar5 >> 7) * auVar60._60_4_;
        auVar60 = vgatherdps_avx512f(ioptr[1]);
        auVar28._4_4_ = (uint)((byte)(uVar10 >> 1) & 1) * auVar60._4_4_;
        auVar28._0_4_ = (uint)(bVar4 & 1) * auVar60._0_4_;
        auVar28._8_4_ = (uint)((byte)(uVar10 >> 2) & 1) * auVar60._8_4_;
        auVar28._12_4_ = (uint)((byte)(uVar10 >> 3) & 1) * auVar60._12_4_;
        auVar28._16_4_ = (uint)((byte)(uVar10 >> 4) & 1) * auVar60._16_4_;
        auVar28._20_4_ = (uint)((byte)(uVar10 >> 5) & 1) * auVar60._20_4_;
        auVar28._24_4_ = (uint)((byte)(uVar10 >> 6) & 1) * auVar60._24_4_;
        auVar28._28_4_ = (uint)((byte)(uVar10 >> 7) & 1) * auVar60._28_4_;
        auVar28._32_4_ = (uint)(bVar5 & 1) * auVar60._32_4_;
        auVar28._36_4_ = (uint)(bVar5 >> 1 & 1) * auVar60._36_4_;
        auVar28._40_4_ = (uint)(bVar5 >> 2 & 1) * auVar60._40_4_;
        auVar28._44_4_ = (uint)(bVar5 >> 3 & 1) * auVar60._44_4_;
        auVar28._48_4_ = (uint)(bVar5 >> 4 & 1) * auVar60._48_4_;
        auVar28._52_4_ = (uint)(bVar5 >> 5 & 1) * auVar60._52_4_;
        auVar28._56_4_ = (uint)(bVar5 >> 6 & 1) * auVar60._56_4_;
        auVar28._60_4_ = (uint)(bVar5 >> 7) * auVar60._60_4_;
        auVar60 = vgatherdps_avx512f(*(undefined4 *)((long)ioptr + unaff_RBP));
        auVar29._4_4_ = (uint)((byte)(uVar10 >> 1) & 1) * auVar60._4_4_;
        auVar29._0_4_ = (uint)(bVar4 & 1) * auVar60._0_4_;
        auVar29._8_4_ = (uint)((byte)(uVar10 >> 2) & 1) * auVar60._8_4_;
        auVar29._12_4_ = (uint)((byte)(uVar10 >> 3) & 1) * auVar60._12_4_;
        auVar29._16_4_ = (uint)((byte)(uVar10 >> 4) & 1) * auVar60._16_4_;
        auVar29._20_4_ = (uint)((byte)(uVar10 >> 5) & 1) * auVar60._20_4_;
        auVar29._24_4_ = (uint)((byte)(uVar10 >> 6) & 1) * auVar60._24_4_;
        auVar29._28_4_ = (uint)((byte)(uVar10 >> 7) & 1) * auVar60._28_4_;
        auVar29._32_4_ = (uint)(bVar5 & 1) * auVar60._32_4_;
        auVar29._36_4_ = (uint)(bVar5 >> 1 & 1) * auVar60._36_4_;
        auVar29._40_4_ = (uint)(bVar5 >> 2 & 1) * auVar60._40_4_;
        auVar29._44_4_ = (uint)(bVar5 >> 3 & 1) * auVar60._44_4_;
        auVar29._48_4_ = (uint)(bVar5 >> 4 & 1) * auVar60._48_4_;
        auVar29._52_4_ = (uint)(bVar5 >> 5 & 1) * auVar60._52_4_;
        auVar29._56_4_ = (uint)(bVar5 >> 6 & 1) * auVar60._56_4_;
        auVar29._60_4_ = (uint)(bVar5 >> 7) * auVar60._60_4_;
        auVar60 = vgatherdps_avx512f(*(undefined4 *)((long)ioptr + M));
        auVar30._4_4_ = (uint)((byte)(uVar10 >> 1) & 1) * auVar60._4_4_;
        auVar30._0_4_ = (uint)(bVar4 & 1) * auVar60._0_4_;
        auVar30._8_4_ = (uint)((byte)(uVar10 >> 2) & 1) * auVar60._8_4_;
        auVar30._12_4_ = (uint)((byte)(uVar10 >> 3) & 1) * auVar60._12_4_;
        auVar30._16_4_ = (uint)((byte)(uVar10 >> 4) & 1) * auVar60._16_4_;
        auVar30._20_4_ = (uint)((byte)(uVar10 >> 5) & 1) * auVar60._20_4_;
        auVar30._24_4_ = (uint)((byte)(uVar10 >> 6) & 1) * auVar60._24_4_;
        auVar30._28_4_ = (uint)((byte)(uVar10 >> 7) & 1) * auVar60._28_4_;
        auVar30._32_4_ = (uint)(bVar5 & 1) * auVar60._32_4_;
        auVar30._36_4_ = (uint)(bVar5 >> 1 & 1) * auVar60._36_4_;
        auVar30._40_4_ = (uint)(bVar5 >> 2 & 1) * auVar60._40_4_;
        auVar30._44_4_ = (uint)(bVar5 >> 3 & 1) * auVar60._44_4_;
        auVar30._48_4_ = (uint)(bVar5 >> 4 & 1) * auVar60._48_4_;
        auVar30._52_4_ = (uint)(bVar5 >> 5 & 1) * auVar60._52_4_;
        auVar30._56_4_ = (uint)(bVar5 >> 6 & 1) * auVar60._56_4_;
        auVar30._60_4_ = (uint)(bVar5 >> 7) * auVar60._60_4_;
        auVar60 = vgatherdps_avx512f(*(undefined4 *)((long)ioptr + (long)dVar8));
        auVar31._0_4_ = (uint)(bVar4 & 1) * auVar60._0_4_ | (uint)!(bool)(bVar4 & 1) * auVar12._0_4_
        ;
        bVar2 = (bool)((byte)(uVar10 >> 1) & 1);
        auVar31._4_4_ = (uint)bVar2 * auVar60._4_4_ | (uint)!bVar2 * auVar12._4_4_;
        bVar2 = (bool)((byte)(uVar10 >> 2) & 1);
        auVar31._8_4_ = (uint)bVar2 * auVar60._8_4_ | (uint)!bVar2 * auVar12._8_4_;
        bVar2 = (bool)((byte)(uVar10 >> 3) & 1);
        auVar31._12_4_ = (uint)bVar2 * auVar60._12_4_ | (uint)!bVar2 * auVar12._12_4_;
        auVar31._16_4_ = (uint)((byte)(uVar10 >> 4) & 1) * auVar60._16_4_;
        auVar31._20_4_ = (uint)((byte)(uVar10 >> 5) & 1) * auVar60._20_4_;
        auVar31._24_4_ = (uint)((byte)(uVar10 >> 6) & 1) * auVar60._24_4_;
        auVar31._28_4_ = (uint)((byte)(uVar10 >> 7) & 1) * auVar60._28_4_;
        auVar31._32_4_ = (uint)(bVar5 & 1) * auVar60._32_4_;
        auVar31._36_4_ = (uint)(bVar5 >> 1 & 1) * auVar60._36_4_;
        auVar31._40_4_ = (uint)(bVar5 >> 2 & 1) * auVar60._40_4_;
        auVar31._44_4_ = (uint)(bVar5 >> 3 & 1) * auVar60._44_4_;
        auVar31._48_4_ = (uint)(bVar5 >> 4 & 1) * auVar60._48_4_;
        auVar31._52_4_ = (uint)(bVar5 >> 5 & 1) * auVar60._52_4_;
        auVar31._56_4_ = (uint)(bVar5 >> 6 & 1) * auVar60._56_4_;
        auVar31._60_4_ = (uint)(bVar5 >> 7) * auVar60._60_4_;
        auVar60 = vgatherdps_avx512f(*(undefined4 *)((long)ioptr + (long)BRLow));
        auVar32._0_4_ = (uint)(bVar4 & 1) * auVar60._0_4_ | (uint)!(bool)(bVar4 & 1) * auVar13._0_4_
        ;
        bVar2 = (bool)((byte)(uVar10 >> 1) & 1);
        auVar32._4_4_ = (uint)bVar2 * auVar60._4_4_ | (uint)!bVar2 * auVar13._4_4_;
        bVar2 = (bool)((byte)(uVar10 >> 2) & 1);
        auVar32._8_4_ = (uint)bVar2 * auVar60._8_4_ | (uint)!bVar2 * auVar13._8_4_;
        bVar2 = (bool)((byte)(uVar10 >> 3) & 1);
        auVar32._12_4_ = (uint)bVar2 * auVar60._12_4_ | (uint)!bVar2 * auVar13._12_4_;
        auVar32._16_4_ = (uint)((byte)(uVar10 >> 4) & 1) * auVar60._16_4_;
        auVar32._20_4_ = (uint)((byte)(uVar10 >> 5) & 1) * auVar60._20_4_;
        auVar32._24_4_ = (uint)((byte)(uVar10 >> 6) & 1) * auVar60._24_4_;
        auVar32._28_4_ = (uint)((byte)(uVar10 >> 7) & 1) * auVar60._28_4_;
        auVar32._32_4_ = (uint)(bVar5 & 1) * auVar60._32_4_;
        auVar32._36_4_ = (uint)(bVar5 >> 1 & 1) * auVar60._36_4_;
        auVar32._40_4_ = (uint)(bVar5 >> 2 & 1) * auVar60._40_4_;
        auVar32._44_4_ = (uint)(bVar5 >> 3 & 1) * auVar60._44_4_;
        auVar32._48_4_ = (uint)(bVar5 >> 4 & 1) * auVar60._48_4_;
        auVar32._52_4_ = (uint)(bVar5 >> 5 & 1) * auVar60._52_4_;
        auVar32._56_4_ = (uint)(bVar5 >> 6 & 1) * auVar60._56_4_;
        auVar32._60_4_ = (uint)(bVar5 >> 7) * auVar60._60_4_;
        auVar60 = vgatherdps_avx512f(*(undefined4 *)((long)ioptr + in_R9));
        auVar33._0_4_ = (uint)(bVar4 & 1) * auVar60._0_4_ | (uint)!(bool)(bVar4 & 1) * auVar14._0_4_
        ;
        bVar2 = (bool)((byte)(uVar10 >> 1) & 1);
        auVar33._4_4_ = (uint)bVar2 * auVar60._4_4_ | (uint)!bVar2 * auVar14._4_4_;
        bVar2 = (bool)((byte)(uVar10 >> 2) & 1);
        auVar33._8_4_ = (uint)bVar2 * auVar60._8_4_ | (uint)!bVar2 * auVar14._8_4_;
        bVar2 = (bool)((byte)(uVar10 >> 3) & 1);
        auVar33._12_4_ = (uint)bVar2 * auVar60._12_4_ | (uint)!bVar2 * auVar14._12_4_;
        auVar33._16_4_ = (uint)((byte)(uVar10 >> 4) & 1) * auVar60._16_4_;
        auVar33._20_4_ = (uint)((byte)(uVar10 >> 5) & 1) * auVar60._20_4_;
        auVar33._24_4_ = (uint)((byte)(uVar10 >> 6) & 1) * auVar60._24_4_;
        auVar33._28_4_ = (uint)((byte)(uVar10 >> 7) & 1) * auVar60._28_4_;
        auVar33._32_4_ = (uint)(bVar5 & 1) * auVar60._32_4_;
        auVar33._36_4_ = (uint)(bVar5 >> 1 & 1) * auVar60._36_4_;
        auVar33._40_4_ = (uint)(bVar5 >> 2 & 1) * auVar60._40_4_;
        auVar33._44_4_ = (uint)(bVar5 >> 3 & 1) * auVar60._44_4_;
        auVar33._48_4_ = (uint)(bVar5 >> 4 & 1) * auVar60._48_4_;
        auVar33._52_4_ = (uint)(bVar5 >> 5 & 1) * auVar60._52_4_;
        auVar33._56_4_ = (uint)(bVar5 >> 6 & 1) * auVar60._56_4_;
        auVar33._60_4_ = (uint)(bVar5 >> 7) * auVar60._60_4_;
        auVar60 = vgatherdps_avx512f(*(undefined4 *)((long)ioptr + in_R10));
        auVar34._0_4_ = (uint)(bVar4 & 1) * auVar60._0_4_ | (uint)!(bool)(bVar4 & 1) * auVar15._0_4_
        ;
        bVar2 = (bool)((byte)(uVar10 >> 1) & 1);
        auVar34._4_4_ = (uint)bVar2 * auVar60._4_4_ | (uint)!bVar2 * auVar15._4_4_;
        bVar2 = (bool)((byte)(uVar10 >> 2) & 1);
        auVar34._8_4_ = (uint)bVar2 * auVar60._8_4_ | (uint)!bVar2 * auVar15._8_4_;
        bVar2 = (bool)((byte)(uVar10 >> 3) & 1);
        auVar34._12_4_ = (uint)bVar2 * auVar60._12_4_ | (uint)!bVar2 * auVar15._12_4_;
        auVar34._16_4_ = (uint)((byte)(uVar10 >> 4) & 1) * auVar60._16_4_;
        auVar34._20_4_ = (uint)((byte)(uVar10 >> 5) & 1) * auVar60._20_4_;
        auVar34._24_4_ = (uint)((byte)(uVar10 >> 6) & 1) * auVar60._24_4_;
        auVar34._28_4_ = (uint)((byte)(uVar10 >> 7) & 1) * auVar60._28_4_;
        auVar34._32_4_ = (uint)(bVar5 & 1) * auVar60._32_4_;
        auVar34._36_4_ = (uint)(bVar5 >> 1 & 1) * auVar60._36_4_;
        auVar34._40_4_ = (uint)(bVar5 >> 2 & 1) * auVar60._40_4_;
        auVar34._44_4_ = (uint)(bVar5 >> 3 & 1) * auVar60._44_4_;
        auVar34._48_4_ = (uint)(bVar5 >> 4 & 1) * auVar60._48_4_;
        auVar34._52_4_ = (uint)(bVar5 >> 5 & 1) * auVar60._52_4_;
        auVar34._56_4_ = (uint)(bVar5 >> 6 & 1) * auVar60._56_4_;
        auVar34._60_4_ = (uint)(bVar5 >> 7) * auVar60._60_4_;
        auVar60 = vaddps_avx512f(auVar29,auVar27);
        auVar61 = vsubps_avx512f(auVar27,auVar29);
        auVar65 = vaddps_avx512f(auVar30,auVar28);
        auVar66 = vsubps_avx512f(auVar28,auVar30);
        auVar67 = vsubps_avx512f(auVar31,auVar33);
        auVar62 = vaddps_avx512f(auVar33,auVar31);
        auVar63 = vsubps_avx512f(auVar32,auVar34);
        auVar64 = vaddps_avx512f(auVar34,auVar32);
        in_ZMM18 = vaddps_avx512f(auVar62,auVar60);
        in_ZMM16 = vsubps_avx512f(auVar60,auVar62);
        in_ZMM19 = vaddps_avx512f(auVar64,auVar65);
        auVar60 = vaddps_avx512f(auVar63,auVar61);
        auVar61 = vsubps_avx512f(auVar61,auVar63);
        in_ZMM17 = vsubps_avx512f(auVar65,auVar64);
        auVar65 = vsubps_avx512f(auVar66,auVar67);
        auVar66 = vaddps_avx512f(auVar67,auVar66);
        auVar67 = vmulps_avx512f(in_ZMM18,auVar56);
        auVar62 = vmulps_avx512f(in_ZMM19,auVar56);
        auVar61 = vmulps_avx512f(auVar61,auVar56);
        auVar66 = vmulps_avx512f(auVar66,auVar56);
        vscatterdps_avx512f(ZEXT864(ioptr) + _DAT_00109e40,uVar7,auVar67);
        auVar67 = vmulps_avx512f(in_ZMM16,auVar56);
        vscatterdps_avx512f(ZEXT864(ioptr) + _DAT_0010a000,uVar7,auVar62);
        vscatterdps_avx512f(ZEXT864(ioptr) + _DAT_00109f00,uVar7,auVar61);
        vscatterdps_avx512f(ZEXT864(ioptr) + _DAT_00109f40,uVar7,auVar66);
        auVar61 = vmulps_avx512f(in_ZMM17,auVar56);
        vscatterdps_avx512f(ZEXT864(ioptr) + _DAT_00109e80,uVar7,auVar67);
        auVar60 = vmulps_avx512f(auVar60,auVar56);
        vscatterdps_avx512f(ZEXT864(ioptr) + _DAT_00109ec0,uVar7,auVar61);
        auVar61 = vmulps_avx512f(auVar65,auVar56);
        vscatterdps_avx512f(ZEXT864(ioptr) + _DAT_00109f80,uVar7,auVar60);
        vscatterdps_avx512f(ZEXT864(ioptr) + _DAT_00109fc0,uVar7,auVar61);
        ioptr = ioptr + 0x80;
      } while ((Rows + 0xfU & 0xfffffffffffffff0) != uVar9);
    }
    break;
  case 3:
    if (0 < Rows) {
      auVar57 = vbroadcastss_avx512f(ZEXT416((uint)scale));
      uVar7 = 0;
      uVar9 = Rows + 0xfU & 0xfffffffffffffff0;
      auVar56 = vpbroadcastq_avx512f();
      auVar56 = vmovdqu64_avx512f(auVar56);
      do {
        auVar58 = vpbroadcastq_avx512f();
        auVar59 = vporq_avx512f(auVar58,_DAT_001099c0);
        auVar60 = vmovdqu64_avx512f(auVar56);
        auVar58 = vporq_avx512f(auVar58,_DAT_00109a00);
        auVar12 = vxorps_avx512vl(in_ZMM24._0_16_,in_ZMM24._0_16_);
        auVar13 = vxorps_avx512vl(in_ZMM25._0_16_,in_ZMM25._0_16_);
        auVar14 = vxorps_avx512vl(in_ZMM26._0_16_,in_ZMM26._0_16_);
        auVar15 = vxorps_avx512vl(in_ZMM27._0_16_,in_ZMM27._0_16_);
        auVar16 = vxorps_avx512vl(in_ZMM28._0_16_,in_ZMM28._0_16_);
        auVar17 = vxorps_avx512vl(in_ZMM29._0_16_,in_ZMM29._0_16_);
        auVar18 = vxorps_avx512vl(in_ZMM30._0_16_,in_ZMM30._0_16_);
        auVar19 = vxorps_avx512vl(in_ZMM31._0_16_,in_ZMM31._0_16_);
        auVar20 = vxorps_avx512vl(in_ZMM21._0_16_,in_ZMM21._0_16_);
        uVar7 = uVar7 + 0x10;
        uVar3 = vpcmpuq_avx512f(auVar58,auVar60,2);
        bVar4 = (byte)uVar3;
        uVar3 = vpcmpuq_avx512f(auVar59,auVar60,2);
        bVar5 = (byte)uVar3;
        auVar21 = vpxord_avx512vl(auVar58._0_16_,auVar58._0_16_);
        auVar22 = vpxord_avx512vl(auVar59._0_16_,auVar59._0_16_);
        uVar10 = CONCAT11(bVar5,bVar4);
        uVar11 = (ulong)uVar10;
        auVar58 = vgatherdps_avx512f(*(undefined4 *)((long)ioptr + uVar9));
        auVar59._0_4_ = (uint)(bVar4 & 1) * auVar58._0_4_ | (uint)!(bool)(bVar4 & 1) * auVar21._0_4_
        ;
        bVar2 = (bool)((byte)(uVar10 >> 1) & 1);
        auVar59._4_4_ = (uint)bVar2 * auVar58._4_4_ | (uint)!bVar2 * auVar21._4_4_;
        bVar2 = (bool)((byte)(uVar10 >> 2) & 1);
        auVar59._8_4_ = (uint)bVar2 * auVar58._8_4_ | (uint)!bVar2 * auVar21._8_4_;
        bVar2 = (bool)((byte)(uVar10 >> 3) & 1);
        auVar59._12_4_ = (uint)bVar2 * auVar58._12_4_ | (uint)!bVar2 * auVar21._12_4_;
        auVar59._16_4_ = (uint)((byte)(uVar10 >> 4) & 1) * auVar58._16_4_;
        auVar59._20_4_ = (uint)((byte)(uVar10 >> 5) & 1) * auVar58._20_4_;
        auVar59._24_4_ = (uint)((byte)(uVar10 >> 6) & 1) * auVar58._24_4_;
        auVar59._28_4_ = (uint)((byte)(uVar10 >> 7) & 1) * auVar58._28_4_;
        auVar59._32_4_ = (uint)(bVar5 & 1) * auVar58._32_4_;
        auVar59._36_4_ = (uint)(bVar5 >> 1 & 1) * auVar58._36_4_;
        auVar59._40_4_ = (uint)(bVar5 >> 2 & 1) * auVar58._40_4_;
        auVar59._44_4_ = (uint)(bVar5 >> 3 & 1) * auVar58._44_4_;
        auVar59._48_4_ = (uint)(bVar5 >> 4 & 1) * auVar58._48_4_;
        auVar59._52_4_ = (uint)(bVar5 >> 5 & 1) * auVar58._52_4_;
        auVar59._56_4_ = (uint)(bVar5 >> 6 & 1) * auVar58._56_4_;
        auVar59._60_4_ = (uint)(bVar5 >> 7) * auVar58._60_4_;
        auVar58 = vgatherdps_avx512f(*(undefined4 *)((long)ioptr + uVar9 + 4));
        auVar35._0_4_ = (uint)(bVar4 & 1) * auVar58._0_4_ | (uint)!(bool)(bVar4 & 1) * auVar22._0_4_
        ;
        bVar2 = (bool)((byte)(uVar10 >> 1) & 1);
        auVar35._4_4_ = (uint)bVar2 * auVar58._4_4_ | (uint)!bVar2 * auVar22._4_4_;
        bVar2 = (bool)((byte)(uVar10 >> 2) & 1);
        auVar35._8_4_ = (uint)bVar2 * auVar58._8_4_ | (uint)!bVar2 * auVar22._8_4_;
        bVar2 = (bool)((byte)(uVar10 >> 3) & 1);
        auVar35._12_4_ = (uint)bVar2 * auVar58._12_4_ | (uint)!bVar2 * auVar22._12_4_;
        auVar35._16_4_ = (uint)((byte)(uVar10 >> 4) & 1) * auVar58._16_4_;
        auVar35._20_4_ = (uint)((byte)(uVar10 >> 5) & 1) * auVar58._20_4_;
        auVar35._24_4_ = (uint)((byte)(uVar10 >> 6) & 1) * auVar58._24_4_;
        auVar35._28_4_ = (uint)((byte)(uVar10 >> 7) & 1) * auVar58._28_4_;
        auVar35._32_4_ = (uint)(bVar5 & 1) * auVar58._32_4_;
        auVar35._36_4_ = (uint)(bVar5 >> 1 & 1) * auVar58._36_4_;
        auVar35._40_4_ = (uint)(bVar5 >> 2 & 1) * auVar58._40_4_;
        auVar35._44_4_ = (uint)(bVar5 >> 3 & 1) * auVar58._44_4_;
        auVar35._48_4_ = (uint)(bVar5 >> 4 & 1) * auVar58._48_4_;
        auVar35._52_4_ = (uint)(bVar5 >> 5 & 1) * auVar58._52_4_;
        auVar35._56_4_ = (uint)(bVar5 >> 6 & 1) * auVar58._56_4_;
        auVar35._60_4_ = (uint)(bVar5 >> 7) * auVar58._60_4_;
        auVar58 = vgatherdps_avx512f(*(undefined4 *)((long)ioptr + in_R10));
        auVar36._0_4_ = (uint)(bVar4 & 1) * auVar58._0_4_ | (uint)!(bool)(bVar4 & 1) * auVar12._0_4_
        ;
        bVar2 = (bool)((byte)(uVar10 >> 1) & 1);
        auVar36._4_4_ = (uint)bVar2 * auVar58._4_4_ | (uint)!bVar2 * auVar12._4_4_;
        bVar2 = (bool)((byte)(uVar10 >> 2) & 1);
        auVar36._8_4_ = (uint)bVar2 * auVar58._8_4_ | (uint)!bVar2 * auVar12._8_4_;
        bVar2 = (bool)((byte)(uVar10 >> 3) & 1);
        auVar36._12_4_ = (uint)bVar2 * auVar58._12_4_ | (uint)!bVar2 * auVar12._12_4_;
        auVar36._16_4_ = (uint)((byte)(uVar10 >> 4) & 1) * auVar58._16_4_;
        auVar36._20_4_ = (uint)((byte)(uVar10 >> 5) & 1) * auVar58._20_4_;
        auVar36._24_4_ = (uint)((byte)(uVar10 >> 6) & 1) * auVar58._24_4_;
        auVar36._28_4_ = (uint)((byte)(uVar10 >> 7) & 1) * auVar58._28_4_;
        auVar36._32_4_ = (uint)(bVar5 & 1) * auVar58._32_4_;
        auVar36._36_4_ = (uint)(bVar5 >> 1 & 1) * auVar58._36_4_;
        auVar36._40_4_ = (uint)(bVar5 >> 2 & 1) * auVar58._40_4_;
        auVar36._44_4_ = (uint)(bVar5 >> 3 & 1) * auVar58._44_4_;
        auVar36._48_4_ = (uint)(bVar5 >> 4 & 1) * auVar58._48_4_;
        auVar36._52_4_ = (uint)(bVar5 >> 5 & 1) * auVar58._52_4_;
        auVar36._56_4_ = (uint)(bVar5 >> 6 & 1) * auVar58._56_4_;
        auVar36._60_4_ = (uint)(bVar5 >> 7) * auVar58._60_4_;
        auVar60 = vgatherdps_avx512f(*(undefined4 *)((long)ioptr + in_R11));
        auVar58._0_4_ = (uint)(bVar4 & 1) * auVar60._0_4_ | (uint)!(bool)(bVar4 & 1) * auVar13._0_4_
        ;
        bVar2 = (bool)((byte)(uVar10 >> 1) & 1);
        auVar58._4_4_ = (uint)bVar2 * auVar60._4_4_ | (uint)!bVar2 * auVar13._4_4_;
        bVar2 = (bool)((byte)(uVar10 >> 2) & 1);
        auVar58._8_4_ = (uint)bVar2 * auVar60._8_4_ | (uint)!bVar2 * auVar13._8_4_;
        bVar2 = (bool)((byte)(uVar10 >> 3) & 1);
        auVar58._12_4_ = (uint)bVar2 * auVar60._12_4_ | (uint)!bVar2 * auVar13._12_4_;
        auVar58._16_4_ = (uint)((byte)(uVar10 >> 4) & 1) * auVar60._16_4_;
        auVar58._20_4_ = (uint)((byte)(uVar10 >> 5) & 1) * auVar60._20_4_;
        auVar58._24_4_ = (uint)((byte)(uVar10 >> 6) & 1) * auVar60._24_4_;
        auVar58._28_4_ = (uint)((byte)(uVar10 >> 7) & 1) * auVar60._28_4_;
        auVar58._32_4_ = (uint)(bVar5 & 1) * auVar60._32_4_;
        auVar58._36_4_ = (uint)(bVar5 >> 1 & 1) * auVar60._36_4_;
        auVar58._40_4_ = (uint)(bVar5 >> 2 & 1) * auVar60._40_4_;
        auVar58._44_4_ = (uint)(bVar5 >> 3 & 1) * auVar60._44_4_;
        auVar58._48_4_ = (uint)(bVar5 >> 4 & 1) * auVar60._48_4_;
        auVar58._52_4_ = (uint)(bVar5 >> 5 & 1) * auVar60._52_4_;
        auVar58._56_4_ = (uint)(bVar5 >> 6 & 1) * auVar60._56_4_;
        auVar58._60_4_ = (uint)(bVar5 >> 7) * auVar60._60_4_;
        auVar60 = vgatherdps_avx512f(*(undefined4 *)((long)ioptr + M));
        auVar37._0_4_ = (uint)(bVar4 & 1) * auVar60._0_4_ | (uint)!(bool)(bVar4 & 1) * auVar14._0_4_
        ;
        bVar2 = (bool)((byte)(uVar10 >> 1) & 1);
        auVar37._4_4_ = (uint)bVar2 * auVar60._4_4_ | (uint)!bVar2 * auVar14._4_4_;
        bVar2 = (bool)((byte)(uVar10 >> 2) & 1);
        auVar37._8_4_ = (uint)bVar2 * auVar60._8_4_ | (uint)!bVar2 * auVar14._8_4_;
        bVar2 = (bool)((byte)(uVar10 >> 3) & 1);
        auVar37._12_4_ = (uint)bVar2 * auVar60._12_4_ | (uint)!bVar2 * auVar14._12_4_;
        auVar37._16_4_ = (uint)((byte)(uVar10 >> 4) & 1) * auVar60._16_4_;
        auVar37._20_4_ = (uint)((byte)(uVar10 >> 5) & 1) * auVar60._20_4_;
        auVar37._24_4_ = (uint)((byte)(uVar10 >> 6) & 1) * auVar60._24_4_;
        auVar37._28_4_ = (uint)((byte)(uVar10 >> 7) & 1) * auVar60._28_4_;
        auVar37._32_4_ = (uint)(bVar5 & 1) * auVar60._32_4_;
        auVar37._36_4_ = (uint)(bVar5 >> 1 & 1) * auVar60._36_4_;
        auVar37._40_4_ = (uint)(bVar5 >> 2 & 1) * auVar60._40_4_;
        auVar37._44_4_ = (uint)(bVar5 >> 3 & 1) * auVar60._44_4_;
        auVar37._48_4_ = (uint)(bVar5 >> 4 & 1) * auVar60._48_4_;
        auVar37._52_4_ = (uint)(bVar5 >> 5 & 1) * auVar60._52_4_;
        auVar37._56_4_ = (uint)(bVar5 >> 6 & 1) * auVar60._56_4_;
        auVar37._60_4_ = (uint)(bVar5 >> 7) * auVar60._60_4_;
        auVar60 = vgatherdps_avx512f(*(undefined4 *)((long)ioptr + unaff_R13));
        auVar38._0_4_ = (uint)(bVar4 & 1) * auVar60._0_4_ | (uint)!(bool)(bVar4 & 1) * auVar15._0_4_
        ;
        bVar2 = (bool)((byte)(uVar10 >> 1) & 1);
        auVar38._4_4_ = (uint)bVar2 * auVar60._4_4_ | (uint)!bVar2 * auVar15._4_4_;
        bVar2 = (bool)((byte)(uVar10 >> 2) & 1);
        auVar38._8_4_ = (uint)bVar2 * auVar60._8_4_ | (uint)!bVar2 * auVar15._8_4_;
        bVar2 = (bool)((byte)(uVar10 >> 3) & 1);
        auVar38._12_4_ = (uint)bVar2 * auVar60._12_4_ | (uint)!bVar2 * auVar15._12_4_;
        auVar38._16_4_ = (uint)((byte)(uVar10 >> 4) & 1) * auVar60._16_4_;
        auVar38._20_4_ = (uint)((byte)(uVar10 >> 5) & 1) * auVar60._20_4_;
        auVar38._24_4_ = (uint)((byte)(uVar10 >> 6) & 1) * auVar60._24_4_;
        auVar38._28_4_ = (uint)((byte)(uVar10 >> 7) & 1) * auVar60._28_4_;
        auVar38._32_4_ = (uint)(bVar5 & 1) * auVar60._32_4_;
        auVar38._36_4_ = (uint)(bVar5 >> 1 & 1) * auVar60._36_4_;
        auVar38._40_4_ = (uint)(bVar5 >> 2 & 1) * auVar60._40_4_;
        auVar38._44_4_ = (uint)(bVar5 >> 3 & 1) * auVar60._44_4_;
        auVar38._48_4_ = (uint)(bVar5 >> 4 & 1) * auVar60._48_4_;
        auVar38._52_4_ = (uint)(bVar5 >> 5 & 1) * auVar60._52_4_;
        auVar38._56_4_ = (uint)(bVar5 >> 6 & 1) * auVar60._56_4_;
        auVar38._60_4_ = (uint)(bVar5 >> 7) * auVar60._60_4_;
        auVar60 = vgatherdps_avx512f(*(undefined4 *)((long)ioptr + Rows + -1));
        auVar39._0_4_ = (uint)(bVar4 & 1) * auVar60._0_4_ | (uint)!(bool)(bVar4 & 1) * auVar16._0_4_
        ;
        bVar2 = (bool)((byte)(uVar10 >> 1) & 1);
        auVar39._4_4_ = (uint)bVar2 * auVar60._4_4_ | (uint)!bVar2 * auVar16._4_4_;
        bVar2 = (bool)((byte)(uVar10 >> 2) & 1);
        auVar39._8_4_ = (uint)bVar2 * auVar60._8_4_ | (uint)!bVar2 * auVar16._8_4_;
        bVar2 = (bool)((byte)(uVar10 >> 3) & 1);
        auVar39._12_4_ = (uint)bVar2 * auVar60._12_4_ | (uint)!bVar2 * auVar16._12_4_;
        auVar39._16_4_ = (uint)((byte)(uVar10 >> 4) & 1) * auVar60._16_4_;
        auVar39._20_4_ = (uint)((byte)(uVar10 >> 5) & 1) * auVar60._20_4_;
        auVar39._24_4_ = (uint)((byte)(uVar10 >> 6) & 1) * auVar60._24_4_;
        auVar39._28_4_ = (uint)((byte)(uVar10 >> 7) & 1) * auVar60._28_4_;
        auVar39._32_4_ = (uint)(bVar5 & 1) * auVar60._32_4_;
        auVar39._36_4_ = (uint)(bVar5 >> 1 & 1) * auVar60._36_4_;
        auVar39._40_4_ = (uint)(bVar5 >> 2 & 1) * auVar60._40_4_;
        auVar39._44_4_ = (uint)(bVar5 >> 3 & 1) * auVar60._44_4_;
        auVar39._48_4_ = (uint)(bVar5 >> 4 & 1) * auVar60._48_4_;
        auVar39._52_4_ = (uint)(bVar5 >> 5 & 1) * auVar60._52_4_;
        auVar39._56_4_ = (uint)(bVar5 >> 6 & 1) * auVar60._56_4_;
        auVar39._60_4_ = (uint)(bVar5 >> 7) * auVar60._60_4_;
        auVar60 = vgatherdps_avx512f(*(undefined4 *)((long)ioptr + unaff_R15));
        auVar40._0_4_ = (uint)(bVar4 & 1) * auVar60._0_4_ | (uint)!(bool)(bVar4 & 1) * auVar17._0_4_
        ;
        bVar2 = (bool)((byte)(uVar10 >> 1) & 1);
        auVar40._4_4_ = (uint)bVar2 * auVar60._4_4_ | (uint)!bVar2 * auVar17._4_4_;
        bVar2 = (bool)((byte)(uVar10 >> 2) & 1);
        auVar40._8_4_ = (uint)bVar2 * auVar60._8_4_ | (uint)!bVar2 * auVar17._8_4_;
        bVar2 = (bool)((byte)(uVar10 >> 3) & 1);
        auVar40._12_4_ = (uint)bVar2 * auVar60._12_4_ | (uint)!bVar2 * auVar17._12_4_;
        auVar40._16_4_ = (uint)((byte)(uVar10 >> 4) & 1) * auVar60._16_4_;
        auVar40._20_4_ = (uint)((byte)(uVar10 >> 5) & 1) * auVar60._20_4_;
        auVar40._24_4_ = (uint)((byte)(uVar10 >> 6) & 1) * auVar60._24_4_;
        auVar40._28_4_ = (uint)((byte)(uVar10 >> 7) & 1) * auVar60._28_4_;
        auVar40._32_4_ = (uint)(bVar5 & 1) * auVar60._32_4_;
        auVar40._36_4_ = (uint)(bVar5 >> 1 & 1) * auVar60._36_4_;
        auVar40._40_4_ = (uint)(bVar5 >> 2 & 1) * auVar60._40_4_;
        auVar40._44_4_ = (uint)(bVar5 >> 3 & 1) * auVar60._44_4_;
        auVar40._48_4_ = (uint)(bVar5 >> 4 & 1) * auVar60._48_4_;
        auVar40._52_4_ = (uint)(bVar5 >> 5 & 1) * auVar60._52_4_;
        auVar40._56_4_ = (uint)(bVar5 >> 6 & 1) * auVar60._56_4_;
        auVar40._60_4_ = (uint)(bVar5 >> 7) * auVar60._60_4_;
        auVar60 = vaddps_avx512f(auVar36,auVar59);
        auVar59 = vsubps_avx512f(auVar59,auVar36);
        auVar61 = vgatherdps_avx512f(*(undefined4 *)((long)ioptr + uVar9));
        auVar41._0_4_ = (uint)(bVar4 & 1) * auVar61._0_4_ | (uint)!(bool)(bVar4 & 1) * auVar18._0_4_
        ;
        bVar2 = (bool)((byte)(uVar10 >> 1) & 1);
        auVar41._4_4_ = (uint)bVar2 * auVar61._4_4_ | (uint)!bVar2 * auVar18._4_4_;
        bVar2 = (bool)((byte)(uVar10 >> 2) & 1);
        auVar41._8_4_ = (uint)bVar2 * auVar61._8_4_ | (uint)!bVar2 * auVar18._8_4_;
        bVar2 = (bool)((byte)(uVar10 >> 3) & 1);
        auVar41._12_4_ = (uint)bVar2 * auVar61._12_4_ | (uint)!bVar2 * auVar18._12_4_;
        auVar41._16_4_ = (uint)((byte)(uVar10 >> 4) & 1) * auVar61._16_4_;
        auVar41._20_4_ = (uint)((byte)(uVar10 >> 5) & 1) * auVar61._20_4_;
        auVar41._24_4_ = (uint)((byte)(uVar10 >> 6) & 1) * auVar61._24_4_;
        auVar41._28_4_ = (uint)((byte)(uVar10 >> 7) & 1) * auVar61._28_4_;
        auVar41._32_4_ = (uint)(bVar5 & 1) * auVar61._32_4_;
        auVar41._36_4_ = (uint)(bVar5 >> 1 & 1) * auVar61._36_4_;
        auVar41._40_4_ = (uint)(bVar5 >> 2 & 1) * auVar61._40_4_;
        auVar41._44_4_ = (uint)(bVar5 >> 3 & 1) * auVar61._44_4_;
        auVar41._48_4_ = (uint)(bVar5 >> 4 & 1) * auVar61._48_4_;
        auVar41._52_4_ = (uint)(bVar5 >> 5 & 1) * auVar61._52_4_;
        auVar41._56_4_ = (uint)(bVar5 >> 6 & 1) * auVar61._56_4_;
        auVar41._60_4_ = (uint)(bVar5 >> 7) * auVar61._60_4_;
        auVar61 = vaddps_avx512f(auVar58,auVar35);
        auVar58 = vsubps_avx512f(auVar35,auVar58);
        auVar65 = vgatherdps_avx512f(*(undefined4 *)((long)ioptr + Rows));
        auVar42._0_4_ = (uint)(bVar4 & 1) * auVar65._0_4_ | (uint)!(bool)(bVar4 & 1) * auVar19._0_4_
        ;
        bVar2 = (bool)((byte)(uVar10 >> 1) & 1);
        auVar42._4_4_ = (uint)bVar2 * auVar65._4_4_ | (uint)!bVar2 * auVar19._4_4_;
        bVar2 = (bool)((byte)(uVar10 >> 2) & 1);
        auVar42._8_4_ = (uint)bVar2 * auVar65._8_4_ | (uint)!bVar2 * auVar19._8_4_;
        bVar2 = (bool)((byte)(uVar10 >> 3) & 1);
        auVar42._12_4_ = (uint)bVar2 * auVar65._12_4_ | (uint)!bVar2 * auVar19._12_4_;
        auVar42._16_4_ = (uint)((byte)(uVar10 >> 4) & 1) * auVar65._16_4_;
        auVar42._20_4_ = (uint)((byte)(uVar10 >> 5) & 1) * auVar65._20_4_;
        auVar42._24_4_ = (uint)((byte)(uVar10 >> 6) & 1) * auVar65._24_4_;
        auVar42._28_4_ = (uint)((byte)(uVar10 >> 7) & 1) * auVar65._28_4_;
        auVar42._32_4_ = (uint)(bVar5 & 1) * auVar65._32_4_;
        auVar42._36_4_ = (uint)(bVar5 >> 1 & 1) * auVar65._36_4_;
        auVar42._40_4_ = (uint)(bVar5 >> 2 & 1) * auVar65._40_4_;
        auVar42._44_4_ = (uint)(bVar5 >> 3 & 1) * auVar65._44_4_;
        auVar42._48_4_ = (uint)(bVar5 >> 4 & 1) * auVar65._48_4_;
        auVar42._52_4_ = (uint)(bVar5 >> 5 & 1) * auVar65._52_4_;
        auVar42._56_4_ = (uint)(bVar5 >> 6 & 1) * auVar65._56_4_;
        auVar42._60_4_ = (uint)(bVar5 >> 7) * auVar65._60_4_;
        auVar65 = vgatherdps_avx512f(*(undefined4 *)((long)ioptr * 2));
        auVar43._4_4_ = (uint)((byte)(uVar10 >> 1) & 1) * auVar65._4_4_;
        auVar43._0_4_ = (uint)(bVar4 & 1) * auVar65._0_4_;
        auVar43._8_4_ = (uint)((byte)(uVar10 >> 2) & 1) * auVar65._8_4_;
        auVar43._12_4_ = (uint)((byte)(uVar10 >> 3) & 1) * auVar65._12_4_;
        auVar43._16_4_ = (uint)((byte)(uVar10 >> 4) & 1) * auVar65._16_4_;
        auVar43._20_4_ = (uint)((byte)(uVar10 >> 5) & 1) * auVar65._20_4_;
        auVar43._24_4_ = (uint)((byte)(uVar10 >> 6) & 1) * auVar65._24_4_;
        auVar43._28_4_ = (uint)((byte)(uVar10 >> 7) & 1) * auVar65._28_4_;
        auVar43._32_4_ = (uint)(bVar5 & 1) * auVar65._32_4_;
        auVar43._36_4_ = (uint)(bVar5 >> 1 & 1) * auVar65._36_4_;
        auVar43._40_4_ = (uint)(bVar5 >> 2 & 1) * auVar65._40_4_;
        auVar43._44_4_ = (uint)(bVar5 >> 3 & 1) * auVar65._44_4_;
        auVar43._48_4_ = (uint)(bVar5 >> 4 & 1) * auVar65._48_4_;
        auVar43._52_4_ = (uint)(bVar5 >> 5 & 1) * auVar65._52_4_;
        auVar43._56_4_ = (uint)(bVar5 >> 6 & 1) * auVar65._56_4_;
        auVar43._60_4_ = (uint)(bVar5 >> 7) * auVar65._60_4_;
        auVar65 = vgatherdps_avx512f(*ioptr);
        auVar44._4_4_ = (uint)((byte)(uVar10 >> 1) & 1) * auVar65._4_4_;
        auVar44._0_4_ = (uint)(bVar4 & 1) * auVar65._0_4_;
        auVar44._8_4_ = (uint)((byte)(uVar10 >> 2) & 1) * auVar65._8_4_;
        auVar44._12_4_ = (uint)((byte)(uVar10 >> 3) & 1) * auVar65._12_4_;
        auVar44._16_4_ = (uint)((byte)(uVar10 >> 4) & 1) * auVar65._16_4_;
        auVar44._20_4_ = (uint)((byte)(uVar10 >> 5) & 1) * auVar65._20_4_;
        auVar44._24_4_ = (uint)((byte)(uVar10 >> 6) & 1) * auVar65._24_4_;
        auVar44._28_4_ = (uint)((byte)(uVar10 >> 7) & 1) * auVar65._28_4_;
        auVar44._32_4_ = (uint)(bVar5 & 1) * auVar65._32_4_;
        auVar44._36_4_ = (uint)(bVar5 >> 1 & 1) * auVar65._36_4_;
        auVar44._40_4_ = (uint)(bVar5 >> 2 & 1) * auVar65._40_4_;
        auVar44._44_4_ = (uint)(bVar5 >> 3 & 1) * auVar65._44_4_;
        auVar44._48_4_ = (uint)(bVar5 >> 4 & 1) * auVar65._48_4_;
        auVar44._52_4_ = (uint)(bVar5 >> 5 & 1) * auVar65._52_4_;
        auVar44._56_4_ = (uint)(bVar5 >> 6 & 1) * auVar65._56_4_;
        auVar44._60_4_ = (uint)(bVar5 >> 7) * auVar65._60_4_;
        auVar65 = vsubps_avx512f(auVar37,auVar39);
        auVar66 = vaddps_avx512f(auVar39,auVar37);
        auVar67 = vgatherdps_avx512f(*(undefined4 *)((long)ioptr + uVar7));
        auVar45._0_4_ = (uint)(bVar4 & 1) * auVar67._0_4_ | (uint)!(bool)(bVar4 & 1) * auVar20._0_4_
        ;
        bVar2 = (bool)((byte)(uVar10 >> 1) & 1);
        auVar45._4_4_ = (uint)bVar2 * auVar67._4_4_ | (uint)!bVar2 * auVar20._4_4_;
        bVar2 = (bool)((byte)(uVar10 >> 2) & 1);
        auVar45._8_4_ = (uint)bVar2 * auVar67._8_4_ | (uint)!bVar2 * auVar20._8_4_;
        bVar2 = (bool)((byte)(uVar10 >> 3) & 1);
        auVar45._12_4_ = (uint)bVar2 * auVar67._12_4_ | (uint)!bVar2 * auVar20._12_4_;
        auVar45._16_4_ = (uint)((byte)(uVar10 >> 4) & 1) * auVar67._16_4_;
        auVar45._20_4_ = (uint)((byte)(uVar10 >> 5) & 1) * auVar67._20_4_;
        auVar45._24_4_ = (uint)((byte)(uVar10 >> 6) & 1) * auVar67._24_4_;
        auVar45._28_4_ = (uint)((byte)(uVar10 >> 7) & 1) * auVar67._28_4_;
        auVar45._32_4_ = (uint)(bVar5 & 1) * auVar67._32_4_;
        auVar45._36_4_ = (uint)(bVar5 >> 1 & 1) * auVar67._36_4_;
        auVar45._40_4_ = (uint)(bVar5 >> 2 & 1) * auVar67._40_4_;
        auVar45._44_4_ = (uint)(bVar5 >> 3 & 1) * auVar67._44_4_;
        auVar45._48_4_ = (uint)(bVar5 >> 4 & 1) * auVar67._48_4_;
        auVar45._52_4_ = (uint)(bVar5 >> 5 & 1) * auVar67._52_4_;
        auVar45._56_4_ = (uint)(bVar5 >> 6 & 1) * auVar67._56_4_;
        auVar45._60_4_ = (uint)(bVar5 >> 7) * auVar67._60_4_;
        auVar67 = vsubps_avx512f(auVar38,auVar40);
        auVar62 = vaddps_avx512f(auVar40,auVar38);
        auVar63 = vgatherdps_avx512f(*ioptr);
        auVar46._4_4_ = (uint)((byte)(uVar10 >> 1) & 1) * auVar63._4_4_;
        auVar46._0_4_ = (uint)(bVar4 & 1) * auVar63._0_4_;
        auVar46._8_4_ = (uint)((byte)(uVar10 >> 2) & 1) * auVar63._8_4_;
        auVar46._12_4_ = (uint)((byte)(uVar10 >> 3) & 1) * auVar63._12_4_;
        auVar46._16_4_ = (uint)((byte)(uVar10 >> 4) & 1) * auVar63._16_4_;
        auVar46._20_4_ = (uint)((byte)(uVar10 >> 5) & 1) * auVar63._20_4_;
        auVar46._24_4_ = (uint)((byte)(uVar10 >> 6) & 1) * auVar63._24_4_;
        auVar46._28_4_ = (uint)((byte)(uVar10 >> 7) & 1) * auVar63._28_4_;
        auVar46._32_4_ = (uint)(bVar5 & 1) * auVar63._32_4_;
        auVar46._36_4_ = (uint)(bVar5 >> 1 & 1) * auVar63._36_4_;
        auVar46._40_4_ = (uint)(bVar5 >> 2 & 1) * auVar63._40_4_;
        auVar46._44_4_ = (uint)(bVar5 >> 3 & 1) * auVar63._44_4_;
        auVar46._48_4_ = (uint)(bVar5 >> 4 & 1) * auVar63._48_4_;
        auVar46._52_4_ = (uint)(bVar5 >> 5 & 1) * auVar63._52_4_;
        auVar46._56_4_ = (uint)(bVar5 >> 6 & 1) * auVar63._56_4_;
        auVar46._60_4_ = (uint)(bVar5 >> 7) * auVar63._60_4_;
        auVar63 = vgatherdps_avx512f(*(undefined4 *)((long)ioptr + in_R10));
        auVar47._4_4_ = (uint)((byte)(uVar10 >> 1) & 1) * auVar63._4_4_;
        auVar47._0_4_ = (uint)(bVar4 & 1) * auVar63._0_4_;
        auVar47._8_4_ = (uint)((byte)(uVar10 >> 2) & 1) * auVar63._8_4_;
        auVar47._12_4_ = (uint)((byte)(uVar10 >> 3) & 1) * auVar63._12_4_;
        auVar47._16_4_ = (uint)((byte)(uVar10 >> 4) & 1) * auVar63._16_4_;
        auVar47._20_4_ = (uint)((byte)(uVar10 >> 5) & 1) * auVar63._20_4_;
        auVar47._24_4_ = (uint)((byte)(uVar10 >> 6) & 1) * auVar63._24_4_;
        auVar47._28_4_ = (uint)((byte)(uVar10 >> 7) & 1) * auVar63._28_4_;
        auVar47._32_4_ = (uint)(bVar5 & 1) * auVar63._32_4_;
        auVar47._36_4_ = (uint)(bVar5 >> 1 & 1) * auVar63._36_4_;
        auVar47._40_4_ = (uint)(bVar5 >> 2 & 1) * auVar63._40_4_;
        auVar47._44_4_ = (uint)(bVar5 >> 3 & 1) * auVar63._44_4_;
        auVar47._48_4_ = (uint)(bVar5 >> 4 & 1) * auVar63._48_4_;
        auVar47._52_4_ = (uint)(bVar5 >> 5 & 1) * auVar63._52_4_;
        auVar47._56_4_ = (uint)(bVar5 >> 6 & 1) * auVar63._56_4_;
        auVar47._60_4_ = (uint)(bVar5 >> 7) * auVar63._60_4_;
        auVar63 = vaddps_avx512f(auVar66,auVar60);
        auVar60 = vsubps_avx512f(auVar60,auVar66);
        auVar66 = vgatherdps_avx512f(*(undefined4 *)((long)ioptr + in_R11));
        auVar48._4_4_ = (uint)((byte)(uVar10 >> 1) & 1) * auVar66._4_4_;
        auVar48._0_4_ = (uint)(bVar4 & 1) * auVar66._0_4_;
        auVar48._8_4_ = (uint)((byte)(uVar10 >> 2) & 1) * auVar66._8_4_;
        auVar48._12_4_ = (uint)((byte)(uVar10 >> 3) & 1) * auVar66._12_4_;
        auVar48._16_4_ = (uint)((byte)(uVar10 >> 4) & 1) * auVar66._16_4_;
        auVar48._20_4_ = (uint)((byte)(uVar10 >> 5) & 1) * auVar66._20_4_;
        auVar48._24_4_ = (uint)((byte)(uVar10 >> 6) & 1) * auVar66._24_4_;
        auVar48._28_4_ = (uint)((byte)(uVar10 >> 7) & 1) * auVar66._28_4_;
        auVar48._32_4_ = (uint)(bVar5 & 1) * auVar66._32_4_;
        auVar48._36_4_ = (uint)(bVar5 >> 1 & 1) * auVar66._36_4_;
        auVar48._40_4_ = (uint)(bVar5 >> 2 & 1) * auVar66._40_4_;
        auVar48._44_4_ = (uint)(bVar5 >> 3 & 1) * auVar66._44_4_;
        auVar48._48_4_ = (uint)(bVar5 >> 4 & 1) * auVar66._48_4_;
        auVar48._52_4_ = (uint)(bVar5 >> 5 & 1) * auVar66._52_4_;
        auVar48._56_4_ = (uint)(bVar5 >> 6 & 1) * auVar66._56_4_;
        auVar48._60_4_ = (uint)(bVar5 >> 7) * auVar66._60_4_;
        auVar66 = vaddps_avx512f(auVar62,auVar61);
        auVar61 = vsubps_avx512f(auVar61,auVar62);
        auVar62 = vaddps_avx512f(auVar43,auVar41);
        auVar64 = vsubps_avx512f(auVar41,auVar43);
        auVar49 = vaddps_avx512f(auVar67,auVar59);
        auVar59 = vsubps_avx512f(auVar59,auVar67);
        auVar67 = vsubps_avx512f(auVar58,auVar65);
        auVar58 = vaddps_avx512f(auVar65,auVar58);
        auVar65 = vaddps_avx512f(auVar44,auVar42);
        auVar50 = vsubps_avx512f(auVar42,auVar44);
        auVar51 = vsubps_avx512f(auVar45,auVar47);
        auVar52 = vaddps_avx512f(auVar47,auVar45);
        auVar53 = vsubps_avx512f(auVar46,auVar48);
        auVar54 = vaddps_avx512f(auVar48,auVar46);
        auVar55 = vaddps_avx512f(auVar52,auVar62);
        auVar62 = vsubps_avx512f(auVar62,auVar52);
        auVar52 = vaddps_avx512f(auVar54,auVar65);
        auVar65 = vsubps_avx512f(auVar65,auVar54);
        in_ZMM31 = vaddps_avx512f(auVar53,auVar64);
        auVar64 = vsubps_avx512f(auVar64,auVar53);
        auVar53 = vsubps_avx512f(auVar50,auVar51);
        auVar50 = vaddps_avx512f(auVar51,auVar50);
        in_ZMM25 = vsubps_avx512f(auVar61,auVar62);
        auVar61 = vaddps_avx512f(auVar62,auVar61);
        auVar62 = vbroadcastss_avx512f(ZEXT416(0x3f3504f3));
        in_ZMM30 = vsubps_avx512f(auVar63,auVar55);
        auVar63 = vaddps_avx512f(auVar55,auVar63);
        in_ZMM28 = vsubps_avx512f(auVar66,auVar52);
        auVar66 = vaddps_avx512f(auVar52,auVar66);
        in_ZMM24 = vaddps_avx512f(auVar65,auVar60);
        auVar60 = vsubps_avx512f(auVar60,auVar65);
        auVar65 = vmulps_avx512f(auVar63,auVar57);
        auVar60 = vmulps_avx512f(auVar60,auVar57);
        vscatterdps_avx512f(ZEXT864(ioptr) + _DAT_00109a40,uVar11,auVar65);
        auVar65 = vmulps_avx512f(auVar66,auVar57);
        auVar66 = vmulps_avx512f(auVar64,auVar62);
        auVar63 = vmulps_avx512f(auVar50,auVar62);
        auVar64 = vmulps_avx512f(auVar53,auVar62);
        auVar50 = vsubps_avx512f(auVar59,auVar66);
        auVar66 = vaddps_avx512f(auVar63,auVar66);
        vscatterdps_avx512f(ZEXT864(ioptr) + _DAT_00109b40,uVar11,auVar65);
        auVar65 = vaddps_avx512f(auVar50,auVar63);
        auVar62 = vmulps_avx512f(in_ZMM31,auVar62);
        auVar63 = vaddps_avx512f(auVar64,auVar49);
        auVar66 = vsubps_avx512f(auVar58,auVar66);
        in_ZMM27 = vaddps_avx512f(auVar63,auVar62);
        auVar62 = vsubps_avx512f(auVar67,auVar62);
        auVar62 = vaddps_avx512f(auVar62,auVar64);
        in_ZMM21 = vbroadcastss_avx512f(ZEXT416(0x40000000));
        in_ZMM26 = vfmsub213ps_avx512f(auVar59,in_ZMM21,auVar65);
        auVar58 = vfmsub213ps_avx512f(auVar58,in_ZMM21,auVar66);
        auVar59 = vfmsub213ps_avx512f(auVar49,in_ZMM21,in_ZMM27);
        auVar67 = vfmsub213ps_avx512f(auVar67,in_ZMM21,auVar62);
        auVar66 = vmulps_avx512f(auVar66,auVar57);
        auVar63 = vmulps_avx512f(in_ZMM26,auVar57);
        auVar58 = vmulps_avx512f(auVar58,auVar57);
        auVar67 = vmulps_avx512f(auVar67,auVar57);
        vscatterdps_avx512f(ZEXT864(ioptr) + auVar67,uVar11,auVar63);
        auVar61 = vmulps_avx512f(auVar61,auVar57);
        auVar59 = vmulps_avx512f(auVar59,auVar57);
        vscatterdps_avx512f(ZEXT864(ioptr) + auVar66,uVar11,auVar58);
        vscatterdps_avx512f(ZEXT864(ioptr) + _DAT_00109b00,uVar11,auVar60);
        auVar58 = vmulps_avx512f(in_ZMM28,auVar57);
        vscatterdps_avx512f(ZEXT864(ioptr) + _DAT_00109b40,uVar11,auVar61);
        vscatterdps_avx512f(ZEXT864(ioptr) + auVar57,uVar11,auVar59);
        auVar59 = vmulps_avx512f(in_ZMM30,auVar57);
        vscatterdps_avx512f(ZEXT864(ioptr) + _DAT_00109cc0,uVar11,auVar67);
        vscatterdps_avx512f(ZEXT864(ioptr) + _DAT_00109a80,uVar11,auVar59);
        auVar59 = vmulps_avx512f(auVar65,auVar57);
        vscatterdps_avx512f(ZEXT864(ioptr) + _DAT_00109ac0,uVar11,auVar58);
        auVar58 = vmulps_avx512f(in_ZMM24,auVar57);
        vscatterdps_avx512f(ZEXT864(ioptr) + auVar62,uVar11,auVar59);
        auVar59 = vmulps_avx512f(in_ZMM25,auVar57);
        vscatterdps_avx512f(ZEXT864(ioptr) + _DAT_00109cc0,uVar11,auVar66);
        vscatterdps_avx512f(ZEXT864(ioptr) + _DAT_00109b80,uVar11,auVar58);
        auVar58 = vmulps_avx512f(in_ZMM27,auVar57);
        vscatterdps_avx512f(ZEXT864(ioptr) + _DAT_00109bc0,uVar11,auVar59);
        auVar59 = vmulps_avx512f(auVar62,auVar57);
        vscatterdps_avx512f(ZEXT864(ioptr) + _DAT_00109d80,uVar11,auVar58);
        vscatterdps_avx512f(ZEXT864(ioptr) + _DAT_00109dc0,uVar11,auVar59);
        ioptr = ioptr + 0x100;
        in_ZMM29 = _DAT_00109e00;
      } while (uVar9 != uVar7);
    }
    break;
  default:
    if (0 < Rows) {
      StageCnt = (M + -1) / 3;
      auVar56 = vpbroadcastq_avx512f();
      auVar56 = vmovdqu64_avx512f(auVar56);
      lVar1 = M + -1 + StageCnt * -3;
      do {
        scbitrevR2(ioptr,M,BRLow,scale);
        uVar9 = 2;
        if (lVar1 == 1) {
          auVar57 = vmovdqu64_avx512f(auVar56);
          auVar58 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
          auVar59 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
          uVar9 = 0;
          pfVar6 = ioptr;
          do {
            auVar60 = vpbroadcastq_avx512f();
            uVar9 = uVar9 + 0x10;
            auVar61 = vporq_avx512f(auVar60,auVar58);
            auVar60 = vporq_avx512f(auVar60,auVar59);
            uVar3 = vpcmpuq_avx512f(auVar60,auVar57,2);
            bVar4 = (byte)uVar3;
            uVar3 = vpcmpuq_avx512f(auVar61,auVar57,2);
            bVar5 = (byte)uVar3;
            uVar10 = CONCAT11(bVar5,bVar4);
            uVar7 = (ulong)uVar10;
            auVar60 = vgatherdps_avx512f(*(undefined4 *)((long)pfVar6 + (long)BRLow));
            auVar61._4_4_ = (uint)((byte)(uVar10 >> 1) & 1) * auVar60._4_4_;
            auVar61._0_4_ = (uint)(bVar4 & 1) * auVar60._0_4_;
            auVar61._8_4_ = (uint)((byte)(uVar10 >> 2) & 1) * auVar60._8_4_;
            auVar61._12_4_ = (uint)((byte)(uVar10 >> 3) & 1) * auVar60._12_4_;
            auVar61._16_4_ = (uint)((byte)(uVar10 >> 4) & 1) * auVar60._16_4_;
            auVar61._20_4_ = (uint)((byte)(uVar10 >> 5) & 1) * auVar60._20_4_;
            auVar61._24_4_ = (uint)((byte)(uVar10 >> 6) & 1) * auVar60._24_4_;
            auVar61._28_4_ = (uint)((byte)(uVar10 >> 7) & 1) * auVar60._28_4_;
            auVar61._32_4_ = (uint)(bVar5 & 1) * auVar60._32_4_;
            auVar61._36_4_ = (uint)(bVar5 >> 1 & 1) * auVar60._36_4_;
            auVar61._40_4_ = (uint)(bVar5 >> 2 & 1) * auVar60._40_4_;
            auVar61._44_4_ = (uint)(bVar5 >> 3 & 1) * auVar60._44_4_;
            auVar61._48_4_ = (uint)(bVar5 >> 4 & 1) * auVar60._48_4_;
            auVar61._52_4_ = (uint)(bVar5 >> 5 & 1) * auVar60._52_4_;
            auVar61._56_4_ = (uint)(bVar5 >> 6 & 1) * auVar60._56_4_;
            auVar61._60_4_ = (uint)(bVar5 >> 7) * auVar60._60_4_;
            auVar60 = vgatherdps_avx512f(*(undefined4 *)((long)(pfVar6 + 4) + (long)BRLow));
            auVar65._4_4_ = (uint)((byte)(uVar10 >> 1) & 1) * auVar60._4_4_;
            auVar65._0_4_ = (uint)(bVar4 & 1) * auVar60._0_4_;
            auVar65._8_4_ = (uint)((byte)(uVar10 >> 2) & 1) * auVar60._8_4_;
            auVar65._12_4_ = (uint)((byte)(uVar10 >> 3) & 1) * auVar60._12_4_;
            auVar65._16_4_ = (uint)((byte)(uVar10 >> 4) & 1) * auVar60._16_4_;
            auVar65._20_4_ = (uint)((byte)(uVar10 >> 5) & 1) * auVar60._20_4_;
            auVar65._24_4_ = (uint)((byte)(uVar10 >> 6) & 1) * auVar60._24_4_;
            auVar65._28_4_ = (uint)((byte)(uVar10 >> 7) & 1) * auVar60._28_4_;
            auVar65._32_4_ = (uint)(bVar5 & 1) * auVar60._32_4_;
            auVar65._36_4_ = (uint)(bVar5 >> 1 & 1) * auVar60._36_4_;
            auVar65._40_4_ = (uint)(bVar5 >> 2 & 1) * auVar60._40_4_;
            auVar65._44_4_ = (uint)(bVar5 >> 3 & 1) * auVar60._44_4_;
            auVar65._48_4_ = (uint)(bVar5 >> 4 & 1) * auVar60._48_4_;
            auVar65._52_4_ = (uint)(bVar5 >> 5 & 1) * auVar60._52_4_;
            auVar65._56_4_ = (uint)(bVar5 >> 6 & 1) * auVar60._56_4_;
            auVar65._60_4_ = (uint)(bVar5 >> 7) * auVar60._60_4_;
            auVar60 = vgatherdps_avx512f(*(undefined4 *)((long)(pfVar6 + 1) + (long)BRLow));
            auVar66._4_4_ = (uint)((byte)(uVar10 >> 1) & 1) * auVar60._4_4_;
            auVar66._0_4_ = (uint)(bVar4 & 1) * auVar60._0_4_;
            auVar66._8_4_ = (uint)((byte)(uVar10 >> 2) & 1) * auVar60._8_4_;
            auVar66._12_4_ = (uint)((byte)(uVar10 >> 3) & 1) * auVar60._12_4_;
            auVar66._16_4_ = (uint)((byte)(uVar10 >> 4) & 1) * auVar60._16_4_;
            auVar66._20_4_ = (uint)((byte)(uVar10 >> 5) & 1) * auVar60._20_4_;
            auVar66._24_4_ = (uint)((byte)(uVar10 >> 6) & 1) * auVar60._24_4_;
            auVar66._28_4_ = (uint)((byte)(uVar10 >> 7) & 1) * auVar60._28_4_;
            auVar66._32_4_ = (uint)(bVar5 & 1) * auVar60._32_4_;
            auVar66._36_4_ = (uint)(bVar5 >> 1 & 1) * auVar60._36_4_;
            auVar66._40_4_ = (uint)(bVar5 >> 2 & 1) * auVar60._40_4_;
            auVar66._44_4_ = (uint)(bVar5 >> 3 & 1) * auVar60._44_4_;
            auVar66._48_4_ = (uint)(bVar5 >> 4 & 1) * auVar60._48_4_;
            auVar66._52_4_ = (uint)(bVar5 >> 5 & 1) * auVar60._52_4_;
            auVar66._56_4_ = (uint)(bVar5 >> 6 & 1) * auVar60._56_4_;
            auVar66._60_4_ = (uint)(bVar5 >> 7) * auVar60._60_4_;
            auVar60 = vgatherdps_avx512f(*(undefined4 *)((long)(pfVar6 + 5) + (long)BRLow));
            auVar67._4_4_ = (uint)((byte)(uVar10 >> 1) & 1) * auVar60._4_4_;
            auVar67._0_4_ = (uint)(bVar4 & 1) * auVar60._0_4_;
            auVar67._8_4_ = (uint)((byte)(uVar10 >> 2) & 1) * auVar60._8_4_;
            auVar67._12_4_ = (uint)((byte)(uVar10 >> 3) & 1) * auVar60._12_4_;
            auVar67._16_4_ = (uint)((byte)(uVar10 >> 4) & 1) * auVar60._16_4_;
            auVar67._20_4_ = (uint)((byte)(uVar10 >> 5) & 1) * auVar60._20_4_;
            auVar67._24_4_ = (uint)((byte)(uVar10 >> 6) & 1) * auVar60._24_4_;
            auVar67._28_4_ = (uint)((byte)(uVar10 >> 7) & 1) * auVar60._28_4_;
            auVar67._32_4_ = (uint)(bVar5 & 1) * auVar60._32_4_;
            auVar67._36_4_ = (uint)(bVar5 >> 1 & 1) * auVar60._36_4_;
            auVar67._40_4_ = (uint)(bVar5 >> 2 & 1) * auVar60._40_4_;
            auVar67._44_4_ = (uint)(bVar5 >> 3 & 1) * auVar60._44_4_;
            auVar67._48_4_ = (uint)(bVar5 >> 4 & 1) * auVar60._48_4_;
            auVar67._52_4_ = (uint)(bVar5 >> 5 & 1) * auVar60._52_4_;
            auVar67._56_4_ = (uint)(bVar5 >> 6 & 1) * auVar60._56_4_;
            auVar67._60_4_ = (uint)(bVar5 >> 7) * auVar60._60_4_;
            auVar62 = vgatherdps_avx512f(*(undefined4 *)((long)(pfVar6 + 8) + (long)BRLow));
            auVar60._4_4_ = (uint)((byte)(uVar10 >> 1) & 1) * auVar62._4_4_;
            auVar60._0_4_ = (uint)(bVar4 & 1) * auVar62._0_4_;
            auVar60._8_4_ = (uint)((byte)(uVar10 >> 2) & 1) * auVar62._8_4_;
            auVar60._12_4_ = (uint)((byte)(uVar10 >> 3) & 1) * auVar62._12_4_;
            auVar60._16_4_ = (uint)((byte)(uVar10 >> 4) & 1) * auVar62._16_4_;
            auVar60._20_4_ = (uint)((byte)(uVar10 >> 5) & 1) * auVar62._20_4_;
            auVar60._24_4_ = (uint)((byte)(uVar10 >> 6) & 1) * auVar62._24_4_;
            auVar60._28_4_ = (uint)((byte)(uVar10 >> 7) & 1) * auVar62._28_4_;
            auVar60._32_4_ = (uint)(bVar5 & 1) * auVar62._32_4_;
            auVar60._36_4_ = (uint)(bVar5 >> 1 & 1) * auVar62._36_4_;
            auVar60._40_4_ = (uint)(bVar5 >> 2 & 1) * auVar62._40_4_;
            auVar60._44_4_ = (uint)(bVar5 >> 3 & 1) * auVar62._44_4_;
            auVar60._48_4_ = (uint)(bVar5 >> 4 & 1) * auVar62._48_4_;
            auVar60._52_4_ = (uint)(bVar5 >> 5 & 1) * auVar62._52_4_;
            auVar60._56_4_ = (uint)(bVar5 >> 6 & 1) * auVar62._56_4_;
            auVar60._60_4_ = (uint)(bVar5 >> 7) * auVar62._60_4_;
            auVar63 = vgatherdps_avx512f(*(undefined4 *)((long)(pfVar6 + 0xc) + (long)BRLow));
            auVar62._4_4_ = (uint)((byte)(uVar10 >> 1) & 1) * auVar63._4_4_;
            auVar62._0_4_ = (uint)(bVar4 & 1) * auVar63._0_4_;
            auVar62._8_4_ = (uint)((byte)(uVar10 >> 2) & 1) * auVar63._8_4_;
            auVar62._12_4_ = (uint)((byte)(uVar10 >> 3) & 1) * auVar63._12_4_;
            auVar62._16_4_ = (uint)((byte)(uVar10 >> 4) & 1) * auVar63._16_4_;
            auVar62._20_4_ = (uint)((byte)(uVar10 >> 5) & 1) * auVar63._20_4_;
            auVar62._24_4_ = (uint)((byte)(uVar10 >> 6) & 1) * auVar63._24_4_;
            auVar62._28_4_ = (uint)((byte)(uVar10 >> 7) & 1) * auVar63._28_4_;
            auVar62._32_4_ = (uint)(bVar5 & 1) * auVar63._32_4_;
            auVar62._36_4_ = (uint)(bVar5 >> 1 & 1) * auVar63._36_4_;
            auVar62._40_4_ = (uint)(bVar5 >> 2 & 1) * auVar63._40_4_;
            auVar62._44_4_ = (uint)(bVar5 >> 3 & 1) * auVar63._44_4_;
            auVar62._48_4_ = (uint)(bVar5 >> 4 & 1) * auVar63._48_4_;
            auVar62._52_4_ = (uint)(bVar5 >> 5 & 1) * auVar63._52_4_;
            auVar62._56_4_ = (uint)(bVar5 >> 6 & 1) * auVar63._56_4_;
            auVar62._60_4_ = (uint)(bVar5 >> 7) * auVar63._60_4_;
            auVar64 = vgatherdps_avx512f(*(undefined4 *)((long)(pfVar6 + 9) + (long)BRLow));
            auVar63._4_4_ = (uint)((byte)(uVar10 >> 1) & 1) * auVar64._4_4_;
            auVar63._0_4_ = (uint)(bVar4 & 1) * auVar64._0_4_;
            auVar63._8_4_ = (uint)((byte)(uVar10 >> 2) & 1) * auVar64._8_4_;
            auVar63._12_4_ = (uint)((byte)(uVar10 >> 3) & 1) * auVar64._12_4_;
            auVar63._16_4_ = (uint)((byte)(uVar10 >> 4) & 1) * auVar64._16_4_;
            auVar63._20_4_ = (uint)((byte)(uVar10 >> 5) & 1) * auVar64._20_4_;
            auVar63._24_4_ = (uint)((byte)(uVar10 >> 6) & 1) * auVar64._24_4_;
            auVar63._28_4_ = (uint)((byte)(uVar10 >> 7) & 1) * auVar64._28_4_;
            auVar63._32_4_ = (uint)(bVar5 & 1) * auVar64._32_4_;
            auVar63._36_4_ = (uint)(bVar5 >> 1 & 1) * auVar64._36_4_;
            auVar63._40_4_ = (uint)(bVar5 >> 2 & 1) * auVar64._40_4_;
            auVar63._44_4_ = (uint)(bVar5 >> 3 & 1) * auVar64._44_4_;
            auVar63._48_4_ = (uint)(bVar5 >> 4 & 1) * auVar64._48_4_;
            auVar63._52_4_ = (uint)(bVar5 >> 5 & 1) * auVar64._52_4_;
            auVar63._56_4_ = (uint)(bVar5 >> 6 & 1) * auVar64._56_4_;
            auVar63._60_4_ = (uint)(bVar5 >> 7) * auVar64._60_4_;
            auVar64 = vaddps_avx512f(auVar65,auVar61);
            auVar61 = vsubps_avx512f(auVar61,auVar65);
            auVar65 = vgatherdps_avx512f(*(undefined4 *)((long)(pfVar6 + 0xd) + (long)BRLow));
            auVar49._4_4_ = (uint)((byte)(uVar10 >> 1) & 1) * auVar65._4_4_;
            auVar49._0_4_ = (uint)(bVar4 & 1) * auVar65._0_4_;
            auVar49._8_4_ = (uint)((byte)(uVar10 >> 2) & 1) * auVar65._8_4_;
            auVar49._12_4_ = (uint)((byte)(uVar10 >> 3) & 1) * auVar65._12_4_;
            auVar49._16_4_ = (uint)((byte)(uVar10 >> 4) & 1) * auVar65._16_4_;
            auVar49._20_4_ = (uint)((byte)(uVar10 >> 5) & 1) * auVar65._20_4_;
            auVar49._24_4_ = (uint)((byte)(uVar10 >> 6) & 1) * auVar65._24_4_;
            auVar49._28_4_ = (uint)((byte)(uVar10 >> 7) & 1) * auVar65._28_4_;
            auVar49._32_4_ = (uint)(bVar5 & 1) * auVar65._32_4_;
            auVar49._36_4_ = (uint)(bVar5 >> 1 & 1) * auVar65._36_4_;
            auVar49._40_4_ = (uint)(bVar5 >> 2 & 1) * auVar65._40_4_;
            auVar49._44_4_ = (uint)(bVar5 >> 3 & 1) * auVar65._44_4_;
            auVar49._48_4_ = (uint)(bVar5 >> 4 & 1) * auVar65._48_4_;
            auVar49._52_4_ = (uint)(bVar5 >> 5 & 1) * auVar65._52_4_;
            auVar49._56_4_ = (uint)(bVar5 >> 6 & 1) * auVar65._56_4_;
            auVar49._60_4_ = (uint)(bVar5 >> 7) * auVar65._60_4_;
            auVar65 = vaddps_avx512f(auVar67,auVar66);
            auVar66 = vsubps_avx512f(auVar66,auVar67);
            vscatterdps_avx512f(ZEXT864(pfVar6) + _DAT_00109a40,uVar7,auVar64);
            auVar67 = vaddps_avx512f(auVar62,auVar60);
            auVar60 = vsubps_avx512f(auVar60,auVar62);
            vscatterdps_avx512f(ZEXT864(pfVar6) + _DAT_00109e00,uVar7,auVar65);
            vscatterdps_avx512f(ZEXT864(pfVar6) + ZEXT864(0x10) + _DAT_00109a40,uVar7,auVar61);
            auVar61 = vaddps_avx512f(auVar49,auVar63);
            auVar65 = vsubps_avx512f(auVar63,auVar49);
            vscatterdps_avx512f(ZEXT864(pfVar6) + ZEXT864(0x10) + _DAT_00109e00,uVar7,auVar66);
            vscatterdps_avx512f(ZEXT864(pfVar6) + ZEXT864(0x20) + _DAT_00109a40,uVar7,auVar67);
            vscatterdps_avx512f(ZEXT864(pfVar6) + ZEXT864(0x20) + _DAT_00109e00,uVar7,auVar61);
            vscatterdps_avx512f(ZEXT864(pfVar6) + ZEXT864(0x30) + _DAT_00109a40,uVar7,auVar60);
            vscatterdps_avx512f(ZEXT864(pfVar6) + ZEXT864(0x30) + _DAT_00109e00,uVar7,auVar65);
            auVar60 = vgatherdps_avx512f(*(undefined4 *)((long)pfVar6 + 2));
            auVar64._4_4_ = (uint)((byte)(uVar10 >> 1) & 1) * auVar60._4_4_;
            auVar64._0_4_ = (uint)(bVar4 & 1) * auVar60._0_4_;
            auVar64._8_4_ = (uint)((byte)(uVar10 >> 2) & 1) * auVar60._8_4_;
            auVar64._12_4_ = (uint)((byte)(uVar10 >> 3) & 1) * auVar60._12_4_;
            auVar64._16_4_ = (uint)((byte)(uVar10 >> 4) & 1) * auVar60._16_4_;
            auVar64._20_4_ = (uint)((byte)(uVar10 >> 5) & 1) * auVar60._20_4_;
            auVar64._24_4_ = (uint)((byte)(uVar10 >> 6) & 1) * auVar60._24_4_;
            auVar64._28_4_ = (uint)((byte)(uVar10 >> 7) & 1) * auVar60._28_4_;
            auVar64._32_4_ = (uint)(bVar5 & 1) * auVar60._32_4_;
            auVar64._36_4_ = (uint)(bVar5 >> 1 & 1) * auVar60._36_4_;
            auVar64._40_4_ = (uint)(bVar5 >> 2 & 1) * auVar60._40_4_;
            auVar64._44_4_ = (uint)(bVar5 >> 3 & 1) * auVar60._44_4_;
            auVar64._48_4_ = (uint)(bVar5 >> 4 & 1) * auVar60._48_4_;
            auVar64._52_4_ = (uint)(bVar5 >> 5 & 1) * auVar60._52_4_;
            auVar64._56_4_ = (uint)(bVar5 >> 6 & 1) * auVar60._56_4_;
            auVar64._60_4_ = (uint)(bVar5 >> 7) * auVar60._60_4_;
            auVar60 = vgatherdps_avx512f(*(undefined4 *)((long)pfVar6 * 2 + 0x10));
            auVar50._4_4_ = (uint)((byte)(uVar10 >> 1) & 1) * auVar60._4_4_;
            auVar50._0_4_ = (uint)(bVar4 & 1) * auVar60._0_4_;
            auVar50._8_4_ = (uint)((byte)(uVar10 >> 2) & 1) * auVar60._8_4_;
            auVar50._12_4_ = (uint)((byte)(uVar10 >> 3) & 1) * auVar60._12_4_;
            auVar50._16_4_ = (uint)((byte)(uVar10 >> 4) & 1) * auVar60._16_4_;
            auVar50._20_4_ = (uint)((byte)(uVar10 >> 5) & 1) * auVar60._20_4_;
            auVar50._24_4_ = (uint)((byte)(uVar10 >> 6) & 1) * auVar60._24_4_;
            auVar50._28_4_ = (uint)((byte)(uVar10 >> 7) & 1) * auVar60._28_4_;
            auVar50._32_4_ = (uint)(bVar5 & 1) * auVar60._32_4_;
            auVar50._36_4_ = (uint)(bVar5 >> 1 & 1) * auVar60._36_4_;
            auVar50._40_4_ = (uint)(bVar5 >> 2 & 1) * auVar60._40_4_;
            auVar50._44_4_ = (uint)(bVar5 >> 3 & 1) * auVar60._44_4_;
            auVar50._48_4_ = (uint)(bVar5 >> 4 & 1) * auVar60._48_4_;
            auVar50._52_4_ = (uint)(bVar5 >> 5 & 1) * auVar60._52_4_;
            auVar50._56_4_ = (uint)(bVar5 >> 6 & 1) * auVar60._56_4_;
            auVar50._60_4_ = (uint)(bVar5 >> 7) * auVar60._60_4_;
            auVar60 = vgatherdps_avx512f(*(undefined4 *)((long)pfVar6 * 2));
            auVar51._4_4_ = (uint)((byte)(uVar10 >> 1) & 1) * auVar60._4_4_;
            auVar51._0_4_ = (uint)(bVar4 & 1) * auVar60._0_4_;
            auVar51._8_4_ = (uint)((byte)(uVar10 >> 2) & 1) * auVar60._8_4_;
            auVar51._12_4_ = (uint)((byte)(uVar10 >> 3) & 1) * auVar60._12_4_;
            auVar51._16_4_ = (uint)((byte)(uVar10 >> 4) & 1) * auVar60._16_4_;
            auVar51._20_4_ = (uint)((byte)(uVar10 >> 5) & 1) * auVar60._20_4_;
            auVar51._24_4_ = (uint)((byte)(uVar10 >> 6) & 1) * auVar60._24_4_;
            auVar51._28_4_ = (uint)((byte)(uVar10 >> 7) & 1) * auVar60._28_4_;
            auVar51._32_4_ = (uint)(bVar5 & 1) * auVar60._32_4_;
            auVar51._36_4_ = (uint)(bVar5 >> 1 & 1) * auVar60._36_4_;
            auVar51._40_4_ = (uint)(bVar5 >> 2 & 1) * auVar60._40_4_;
            auVar51._44_4_ = (uint)(bVar5 >> 3 & 1) * auVar60._44_4_;
            auVar51._48_4_ = (uint)(bVar5 >> 4 & 1) * auVar60._48_4_;
            auVar51._52_4_ = (uint)(bVar5 >> 5 & 1) * auVar60._52_4_;
            auVar51._56_4_ = (uint)(bVar5 >> 6 & 1) * auVar60._56_4_;
            auVar51._60_4_ = (uint)(bVar5 >> 7) * auVar60._60_4_;
            auVar60 = vgatherdps_avx512f(*(undefined4 *)((long)pfVar6 + 0x12));
            auVar52._4_4_ = (uint)((byte)(uVar10 >> 1) & 1) * auVar60._4_4_;
            auVar52._0_4_ = (uint)(bVar4 & 1) * auVar60._0_4_;
            auVar52._8_4_ = (uint)((byte)(uVar10 >> 2) & 1) * auVar60._8_4_;
            auVar52._12_4_ = (uint)((byte)(uVar10 >> 3) & 1) * auVar60._12_4_;
            auVar52._16_4_ = (uint)((byte)(uVar10 >> 4) & 1) * auVar60._16_4_;
            auVar52._20_4_ = (uint)((byte)(uVar10 >> 5) & 1) * auVar60._20_4_;
            auVar52._24_4_ = (uint)((byte)(uVar10 >> 6) & 1) * auVar60._24_4_;
            auVar52._28_4_ = (uint)((byte)(uVar10 >> 7) & 1) * auVar60._28_4_;
            auVar52._32_4_ = (uint)(bVar5 & 1) * auVar60._32_4_;
            auVar52._36_4_ = (uint)(bVar5 >> 1 & 1) * auVar60._36_4_;
            auVar52._40_4_ = (uint)(bVar5 >> 2 & 1) * auVar60._40_4_;
            auVar52._44_4_ = (uint)(bVar5 >> 3 & 1) * auVar60._44_4_;
            auVar52._48_4_ = (uint)(bVar5 >> 4 & 1) * auVar60._48_4_;
            auVar52._52_4_ = (uint)(bVar5 >> 5 & 1) * auVar60._52_4_;
            auVar52._56_4_ = (uint)(bVar5 >> 6 & 1) * auVar60._56_4_;
            auVar52._60_4_ = (uint)(bVar5 >> 7) * auVar60._60_4_;
            auVar60 = vgatherdps_avx512f(*(undefined4 *)((long)pfVar6 + 0x22));
            auVar53._4_4_ = (uint)((byte)(uVar10 >> 1) & 1) * auVar60._4_4_;
            auVar53._0_4_ = (uint)(bVar4 & 1) * auVar60._0_4_;
            auVar53._8_4_ = (uint)((byte)(uVar10 >> 2) & 1) * auVar60._8_4_;
            auVar53._12_4_ = (uint)((byte)(uVar10 >> 3) & 1) * auVar60._12_4_;
            auVar53._16_4_ = (uint)((byte)(uVar10 >> 4) & 1) * auVar60._16_4_;
            auVar53._20_4_ = (uint)((byte)(uVar10 >> 5) & 1) * auVar60._20_4_;
            auVar53._24_4_ = (uint)((byte)(uVar10 >> 6) & 1) * auVar60._24_4_;
            auVar53._28_4_ = (uint)((byte)(uVar10 >> 7) & 1) * auVar60._28_4_;
            auVar53._32_4_ = (uint)(bVar5 & 1) * auVar60._32_4_;
            auVar53._36_4_ = (uint)(bVar5 >> 1 & 1) * auVar60._36_4_;
            auVar53._40_4_ = (uint)(bVar5 >> 2 & 1) * auVar60._40_4_;
            auVar53._44_4_ = (uint)(bVar5 >> 3 & 1) * auVar60._44_4_;
            auVar53._48_4_ = (uint)(bVar5 >> 4 & 1) * auVar60._48_4_;
            auVar53._52_4_ = (uint)(bVar5 >> 5 & 1) * auVar60._52_4_;
            auVar53._56_4_ = (uint)(bVar5 >> 6 & 1) * auVar60._56_4_;
            auVar53._60_4_ = (uint)(bVar5 >> 7) * auVar60._60_4_;
            auVar60 = vgatherdps_avx512f(*(undefined4 *)((long)pfVar6 * 2 + 0x30));
            auVar54._4_4_ = (uint)((byte)(uVar10 >> 1) & 1) * auVar60._4_4_;
            auVar54._0_4_ = (uint)(bVar4 & 1) * auVar60._0_4_;
            auVar54._8_4_ = (uint)((byte)(uVar10 >> 2) & 1) * auVar60._8_4_;
            auVar54._12_4_ = (uint)((byte)(uVar10 >> 3) & 1) * auVar60._12_4_;
            auVar54._16_4_ = (uint)((byte)(uVar10 >> 4) & 1) * auVar60._16_4_;
            auVar54._20_4_ = (uint)((byte)(uVar10 >> 5) & 1) * auVar60._20_4_;
            auVar54._24_4_ = (uint)((byte)(uVar10 >> 6) & 1) * auVar60._24_4_;
            auVar54._28_4_ = (uint)((byte)(uVar10 >> 7) & 1) * auVar60._28_4_;
            auVar54._32_4_ = (uint)(bVar5 & 1) * auVar60._32_4_;
            auVar54._36_4_ = (uint)(bVar5 >> 1 & 1) * auVar60._36_4_;
            auVar54._40_4_ = (uint)(bVar5 >> 2 & 1) * auVar60._40_4_;
            auVar54._44_4_ = (uint)(bVar5 >> 3 & 1) * auVar60._44_4_;
            auVar54._48_4_ = (uint)(bVar5 >> 4 & 1) * auVar60._48_4_;
            auVar54._52_4_ = (uint)(bVar5 >> 5 & 1) * auVar60._52_4_;
            auVar54._56_4_ = (uint)(bVar5 >> 6 & 1) * auVar60._56_4_;
            auVar54._60_4_ = (uint)(bVar5 >> 7) * auVar60._60_4_;
            auVar60 = vgatherdps_avx512f(*(undefined4 *)((long)pfVar6 * 2 + 0x20));
            auVar55._4_4_ = (uint)((byte)(uVar10 >> 1) & 1) * auVar60._4_4_;
            auVar55._0_4_ = (uint)(bVar4 & 1) * auVar60._0_4_;
            auVar55._8_4_ = (uint)((byte)(uVar10 >> 2) & 1) * auVar60._8_4_;
            auVar55._12_4_ = (uint)((byte)(uVar10 >> 3) & 1) * auVar60._12_4_;
            auVar55._16_4_ = (uint)((byte)(uVar10 >> 4) & 1) * auVar60._16_4_;
            auVar55._20_4_ = (uint)((byte)(uVar10 >> 5) & 1) * auVar60._20_4_;
            auVar55._24_4_ = (uint)((byte)(uVar10 >> 6) & 1) * auVar60._24_4_;
            auVar55._28_4_ = (uint)((byte)(uVar10 >> 7) & 1) * auVar60._28_4_;
            auVar55._32_4_ = (uint)(bVar5 & 1) * auVar60._32_4_;
            auVar55._36_4_ = (uint)(bVar5 >> 1 & 1) * auVar60._36_4_;
            auVar55._40_4_ = (uint)(bVar5 >> 2 & 1) * auVar60._40_4_;
            auVar55._44_4_ = (uint)(bVar5 >> 3 & 1) * auVar60._44_4_;
            auVar55._48_4_ = (uint)(bVar5 >> 4 & 1) * auVar60._48_4_;
            auVar55._52_4_ = (uint)(bVar5 >> 5 & 1) * auVar60._52_4_;
            auVar55._56_4_ = (uint)(bVar5 >> 6 & 1) * auVar60._56_4_;
            auVar55._60_4_ = (uint)(bVar5 >> 7) * auVar60._60_4_;
            auVar60 = vsubps_avx512f(auVar64,auVar50);
            auVar61 = vaddps_avx512f(auVar50,auVar64);
            auVar65 = vgatherdps_avx512f(*(undefined4 *)((long)pfVar6 + 0x32));
            auVar68._4_4_ = (uint)((byte)(uVar10 >> 1) & 1) * auVar65._4_4_;
            auVar68._0_4_ = (uint)(bVar4 & 1) * auVar65._0_4_;
            auVar68._8_4_ = (uint)((byte)(uVar10 >> 2) & 1) * auVar65._8_4_;
            auVar68._12_4_ = (uint)((byte)(uVar10 >> 3) & 1) * auVar65._12_4_;
            auVar68._16_4_ = (uint)((byte)(uVar10 >> 4) & 1) * auVar65._16_4_;
            auVar68._20_4_ = (uint)((byte)(uVar10 >> 5) & 1) * auVar65._20_4_;
            auVar68._24_4_ = (uint)((byte)(uVar10 >> 6) & 1) * auVar65._24_4_;
            auVar68._28_4_ = (uint)((byte)(uVar10 >> 7) & 1) * auVar65._28_4_;
            auVar68._32_4_ = (uint)(bVar5 & 1) * auVar65._32_4_;
            auVar68._36_4_ = (uint)(bVar5 >> 1 & 1) * auVar65._36_4_;
            auVar68._40_4_ = (uint)(bVar5 >> 2 & 1) * auVar65._40_4_;
            auVar68._44_4_ = (uint)(bVar5 >> 3 & 1) * auVar65._44_4_;
            auVar68._48_4_ = (uint)(bVar5 >> 4 & 1) * auVar65._48_4_;
            auVar68._52_4_ = (uint)(bVar5 >> 5 & 1) * auVar65._52_4_;
            auVar68._56_4_ = (uint)(bVar5 >> 6 & 1) * auVar65._56_4_;
            auVar68._60_4_ = (uint)(bVar5 >> 7) * auVar65._60_4_;
            auVar65 = vaddps_avx512f(auVar52,auVar51);
            auVar66 = vsubps_avx512f(auVar51,auVar52);
            vscatterdps_avx512f(ZEXT864(pfVar6) + _DAT_00109c00,uVar7,auVar60);
            auVar60 = vsubps_avx512f(auVar53,auVar54);
            auVar67 = vaddps_avx512f(auVar54,auVar53);
            vscatterdps_avx512f(ZEXT864(pfVar6) + auVar61,uVar7,auVar65);
            vscatterdps_avx512f(ZEXT864(pfVar6) + ZEXT864(0x10) + _DAT_00109c00,uVar7,auVar61);
            auVar65 = vaddps_avx512f(auVar68,auVar55);
            auVar62 = vsubps_avx512f(auVar55,auVar68);
            vscatterdps_avx512f(ZEXT864(pfVar6) + ZEXT864(0x10) + auVar61,uVar7,auVar66);
            vscatterdps_avx512f(ZEXT864(pfVar6) + ZEXT864(0x20) + _DAT_00109c00,uVar7,auVar60);
            vscatterdps_avx512f(ZEXT864(pfVar6) + ZEXT864(0x20) + auVar61,uVar7,auVar65);
            vscatterdps_avx512f(ZEXT864(pfVar6) + ZEXT864(0x30) + _DAT_00109c00,uVar7,auVar67);
            vscatterdps_avx512f(ZEXT864(pfVar6) + ZEXT864(0x30) + auVar61,uVar7,auVar62);
            pfVar6 = pfVar6 + 0x100;
          } while ((((ulong)(1L << (M & 0x3fU)) >> 3) + 0xf & 0xfffffffffffffff0) != uVar9);
          uVar9 = 4;
        }
        if (lVar1 == 2) {
          ibfR4(ioptr,M,uVar9);
          uVar9 = (ulong)(uint)((int)uVar9 << 2);
        }
        if ((ulong)M < 0xc) {
          ibfstages(ioptr,M,Utbl,1,uVar9,StageCnt);
        }
        else {
          ifftrecurs(ioptr,M,Utbl,1,uVar9,StageCnt);
        }
        ioptr = ioptr + (2L << (M & 0x3fU));
        bVar2 = 1 < Rows;
        Rows = Rows + -1;
      } while (bVar2);
    }
  }
  return;
}

Assistant:

void iffts1(float *ioptr, long M, long Rows, float *Utbl, short *BRLow){
/* Compute in-place inverse complex fft on the rows of the input array	*/
/* INPUTS */
/* *ioptr = input data array	*/
/* M = log2 of fft size	*/
/* Rows = number of rows in ioptr array (use Rows of 1 if ioptr is a 1 dimensional array)	*/
/* *Utbl = cosine table	*/
/* *BRLow = bit reversed counter table	*/
/* OUTPUTS */
/* *ioptr = output data array	*/

long 	StageCnt;
long 	NDiffU;
const float scale = 1.0/POW2(M);

switch (M){
case 0:
	break;
case 1:
	for (;Rows>0;Rows--){
		ifft2pt(ioptr, scale);				/* a 2 pt fft */
		ioptr += 2*POW2(M);
	}
	break;
case 2:
	for (;Rows>0;Rows--){
		ifft4pt(ioptr, scale);				/* a 4 pt fft */
		ioptr += 2*POW2(M);
	}
	break;
case 3:
	for (;Rows>0;Rows--){
		ifft8pt(ioptr, scale);				/* an 8 pt fft */
		ioptr += 2*POW2(M);
	}
	break;
default:
	for (;Rows>0;Rows--){

		scbitrevR2(ioptr, M, BRLow, scale);	/* bit reverse and first radix 2 stage */
		
		StageCnt = (M-1) / 3;		// number of radix 8 stages
		NDiffU = 2;				// one radix 2 stage already complete

		if ( (M-1-(StageCnt * 3)) == 1 ){
			ibfR2(ioptr, M, NDiffU);				/* 1 radix 2 stage */
			NDiffU *= 2;
		}

		if ( (M-1-(StageCnt * 3)) == 2 ){
			ibfR4(ioptr, M, NDiffU);			/* 1 radix 4 stage */
			NDiffU *= 4;
		}

		if (M <= MCACHE)
			ibfstages(ioptr, M, Utbl, 1, NDiffU, StageCnt);		/*  RADIX 8 Stages	*/

		else{
			ifftrecurs(ioptr, M, Utbl, 1, NDiffU, StageCnt);		/*  RADIX 8 Stages	*/
		}

		ioptr += 2*POW2(M);
	}
}
}